

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emu6502.h
# Opt level: O0

cpu_state cpu_execute(cpu_state state)

{
  cpu_state cVar1;
  int iVar2;
  undefined5 uVar3;
  short sVar4;
  undefined6 uVar5;
  int iVar6;
  byte bVar7;
  undefined3 uVar8;
  uint16_t uVar9;
  undefined4 uVar10;
  undefined5 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined7 uVar14;
  char cVar15;
  undefined5 uVar16;
  uint8_t uVar17;
  uint8_t uVar18;
  undefined3 uVar19;
  undefined1 uVar20;
  ulong uVar21;
  byte bVar22;
  byte bVar23;
  char cVar24;
  undefined2 uVar25;
  ushort uVar26;
  uint uVar27;
  ushort uVar28;
  byte local_d8;
  uint8_t overflow_23;
  uint16_t tmp_50;
  uint8_t carry_7;
  uint8_t carry_6;
  uint8_t overflow_22;
  uint16_t tmp_49;
  uint16_t tmp_48;
  uint16_t tmp_47;
  uint8_t overflow_21;
  uint16_t tmp_46;
  uint8_t overflow_20;
  uint16_t tmp_45;
  uint8_t overflow_19;
  uint16_t tmp_44;
  uint8_t carry_5;
  uint8_t carry_4;
  uint8_t overflow_18;
  uint16_t tmp_43;
  uint16_t tmp_42;
  uint8_t tmp_41;
  uint8_t tmp_40;
  uint8_t overflow_17;
  uint16_t tmp_39;
  uint8_t carry_3;
  uint8_t carry_2;
  uint8_t overflow_16;
  uint16_t tmp_38;
  uint16_t tmp_37;
  uint8_t tmp_36;
  uint8_t tmp_35;
  uint16_t tmp_34;
  uint8_t overflow_15;
  uint16_t tmp_33;
  uint8_t overflow_14;
  uint16_t tmp_32;
  uint16_t tmp_31;
  uint8_t overflow_13;
  uint16_t tmp_30;
  uint8_t overflow_12;
  uint16_t tmp_29;
  uint16_t tmp_28;
  uint8_t overflow_11;
  uint16_t tmp_27;
  uint8_t overflow_10;
  uint16_t tmp_26;
  uint8_t overflow_9;
  uint16_t tmp_25;
  uint8_t carry_1;
  uint8_t carry;
  uint8_t overflow_8;
  uint16_t tmp_24;
  uint16_t tmp_23;
  uint8_t tmp_22;
  uint8_t tmp_21;
  uint16_t tmp_20;
  uint8_t overflow_7;
  uint16_t tmp_19;
  uint8_t overflow_6;
  uint16_t tmp_18;
  uint16_t tmp_17;
  uint16_t tmp_16;
  uint16_t tmp_15;
  uint8_t overflow_5;
  uint16_t tmp_14;
  uint8_t overflow_4;
  uint16_t tmp_13;
  uint16_t tmp_12;
  uint16_t tmp_11;
  uint16_t tmp_10;
  uint8_t overflow_3;
  uint16_t tmp_9;
  uint8_t overflow_2;
  uint16_t tmp_8;
  int page_cross;
  uint16_t tmp_7;
  uint16_t tmp_6;
  uint16_t tmp_5;
  uint8_t overflow_1;
  uint16_t tmp_4;
  uint8_t tmp_3;
  uint8_t overflow;
  uint16_t tmp_2;
  uint8_t tmp_1;
  uint8_t tmp;
  uint_fast32_t instruction;
  uint8_t cycle;
  int nmi_phase1;
  int irq_phase1;
  int was_halted;
  cpu_state state_local;
  uint16_t local_10;
  uint16_t uStack_e;
  byte bStack_c;
  byte bStack_b;
  uint16_t uStack_a;
  
  state_local._8_8_ = state._0_8_;
  state_local.cycle._0_1_ = state.rw_mode;
  if ((((undefined1  [16])state & (undefined1  [16])0x100) == (undefined1  [16])0x0) &&
     ((uint8_t)state_local.cycle != '\x02')) {
    state_local._0_8_ = state._8_8_ & 0xfffffffffffffdff | 0x200;
    local_10 = state_local.cycle;
    uStack_e = state_local.PC;
    bStack_c = state_local.S;
    bStack_b = state_local.P;
    uStack_a = state_local.address;
    goto LAB_0010df74;
  }
  state_local._0_8_ = state._8_8_ & 0xfffffffffffffdff;
  bVar23 = state_local.cycle._1_1_;
  bVar22 = state_local.cycle._1_1_ >> 4;
  local_d8 = 0;
  if ((state_local.cycle._1_1_ >> 2 & 1) != 0) {
    local_d8 = ((undefined1  [16])state & (undefined1  [16])0x40000000000) != (undefined1  [16])0x0
               ^ 0xff;
  }
  state_local.cycle =
       CONCAT11(state_local.cycle._1_1_ & 0xef | (local_d8 & 1) << 4,(uint8_t)state_local.cycle);
  bVar23 = (bVar23 & 0x20) >> 5;
  if ((((undefined1  [16])state & (undefined1  [16])0x2000) == (undefined1  [16])0x0) &&
     (((undefined1  [16])state & (undefined1  [16])0x800) != (undefined1  [16])0x0)) {
    state_local._0_8_ = CONCAT62(state_local._2_6_,state_local.cycle) & 0xffffffffffffdfff | 0x2000;
  }
  uVar12 = state_local._0_8_;
  irq_phase1._0_2_ = state.cycle;
  uVar28 = (uint16_t)irq_phase1 + 1;
  stack0xffffffffffffffda = state._2_6_;
  uVar5 = stack0xffffffffffffffda;
  _irq_phase1 = CONCAT62(stack0xffffffffffffffda,uVar28);
  uVar21 = _irq_phase1;
  cVar24 = (char)state.cycle;
  uVar27 = (int)(uint)uVar28 >> 8;
  state_local._9_1_ = (byte)state_local.PC;
  uVar14 = state_local._1_7_;
  was_halted._0_1_ = state.S;
  bStack_b = (byte)was_halted;
  was_halted._1_1_ = state.P;
  bVar7 = was_halted._1_1_;
  irq_phase1._2_2_ = state.PC;
  uVar26 = irq_phase1._2_2_;
  was_halted._2_2_ = state.address;
  uVar9 = was_halted._2_2_;
  was_halted._1_3_ = state._5_3_;
  uVar8 = was_halted._1_3_;
  was_halted = state._4_4_;
  iVar6 = was_halted;
  cVar15 = state_local.PC._1_1_;
  uVar19 = state_local._5_3_;
  uVar16 = state_local._3_5_;
  uVar17 = state_local.S;
  if (cVar24 == '\0') {
    irq_phase1._0_1_ = (uint8_t)uVar28;
    state_local.rw_mode = (uint8_t)irq_phase1;
    uVar25 = CONCAT11(state_local._9_1_,(uint8_t)irq_phase1);
    _irq_phase1 = CONCAT62(uVar5,uVar25);
    state_local._0_8_ = (ulong)(uint7)uVar14 << 8;
    uVar13 = state_local._0_8_;
    state_local.P = SUB81(uVar12,5);
    uVar18 = state_local.P;
    state_local.address._0_1_ = SUB81(uVar12,6);
    bStack_c = (byte)state_local.address;
    state_local.address._1_1_ = SUB81(uVar12,7);
    uVar20 = state_local.address._1_1_;
    state_local.address = SUB82(uVar12,6);
    state_local._0_4_ = SUB84(uVar13,0);
    uVar10 = state_local._0_4_;
    state_local._0_5_ = SUB85(uVar13,0);
    uVar11 = state_local._0_5_;
    state_local._0_6_ = SUB86(uVar13,0);
    iVar2 = irq_phase1;
    uVar3 = _irq_phase1;
    switch((ulong)((uint7)uVar14 >> 8) & 0xff) {
    case 0:
      if (cVar15 != '\0') {
        state_local.cycle._0_1_ = 1;
        state_local._0_8_ = CONCAT71(uVar14,(uint8_t)state_local.cycle);
        was_halted._2_1_ = (uint8_t)uVar26;
        was_halted._3_1_ = (undefined1)(uVar26 >> 8);
        state_local.rw_mode = (uint8_t)irq_phase1;
        state_local._9_1_ = irq_phase1._1_1_;
        state_local.data = irq_phase1._2_1_;
        state_local.temp = irq_phase1._3_1_;
        state_local.A = (byte)was_halted;
        state_local.X = was_halted._1_1_;
        state_local.Y = was_halted._2_1_;
        state_local._15_1_ = was_halted._3_1_;
        state_local.PC = SUB72(uVar14,1);
        state_local.S = SUB71(uVar14,3);
        state_local.P = SUB71(uVar14,4);
        state_local.address = SUB72(uVar14,5);
        local_10 = state_local.cycle;
        uStack_e = state_local.PC;
        bStack_c = state_local.S;
        bStack_b = state_local.P;
        uStack_a = state_local.address;
        break;
      }
    default:
      state_local.cycle._0_1_ = 1;
      state_local._0_8_ = CONCAT71(uVar14,(uint8_t)state_local.cycle);
      irq_phase1 = CONCAT22(uVar26 + 1,uVar25);
      _irq_phase1 = CONCAT44(iVar6,irq_phase1);
      was_halted._2_1_ = (uint8_t)uVar26;
      was_halted._3_1_ = (undefined1)(uVar26 >> 8);
      state_local.rw_mode = (uint8_t)irq_phase1;
      state_local._9_1_ = irq_phase1._1_1_;
      state_local.data = irq_phase1._2_1_;
      state_local.temp = irq_phase1._3_1_;
      state_local.A = (byte)was_halted;
      state_local.X = was_halted._1_1_;
      state_local.Y = was_halted._2_1_;
      state_local._15_1_ = was_halted._3_1_;
      state_local.PC = SUB72(uVar14,1);
      state_local.S = SUB71(uVar14,3);
      state_local.P = SUB71(uVar14,4);
      state_local.address = SUB72(uVar14,5);
      local_10 = state_local.cycle;
      uStack_e = state_local.PC;
      bStack_c = state_local.S;
      bStack_b = state_local.P;
      uStack_a = state_local.address;
      break;
    case 2:
    case 0x12:
    case 0x22:
    case 0x32:
    case 0x42:
    case 0x52:
    case 0x62:
    case 0x72:
    case 0x92:
    case 0xb2:
    case 0xd2:
    case 0xf2:
      irq_phase1._2_1_ = (uint8_t)uVar5;
      irq_phase1._3_1_ = SUB61(uVar5,1);
      was_halted._0_1_ = SUB61(uVar5,2);
      was_halted._1_1_ = SUB61(uVar5,3);
      was_halted._2_1_ = SUB61(uVar5,4);
      was_halted._3_1_ = SUB61(uVar5,5);
      state_local.data = irq_phase1._2_1_;
      state_local.temp = irq_phase1._3_1_;
      state_local.A = (byte)was_halted;
      state_local.X = was_halted._1_1_;
      state_local.Y = was_halted._2_1_;
      state_local._15_1_ = was_halted._3_1_;
      state_local.cycle = (uint16_t)uVar13;
      state_local.PC = SUB82(uVar13,2);
      state_local.S = SUB81(uVar13,4);
      state_local.P = SUB81(uVar13,5);
      state_local.address = SUB82(uVar13,6);
      local_10 = state_local.cycle;
      uStack_e = state_local.PC;
      bStack_c = state_local.S;
      bStack_b = state_local.P;
      uStack_a = state_local.address;
      break;
    case 8:
      state_local.cycle._0_1_ = 2;
      state_local._0_8_ = CONCAT71(uVar14,(uint8_t)state_local.cycle);
      _irq_phase1 = CONCAT14(bStack_b - 1,iVar2);
      _irq_phase1 = CONCAT35(uVar8,_irq_phase1);
      state_local._0_8_ = CONCAT53(uVar16,CONCAT12(bVar7,state_local.cycle)) | 0x100000;
      was_halted._2_1_ = (uint8_t)(bStack_b + 0x100);
      was_halted._3_1_ = (undefined1)((ushort)(bStack_b + 0x100) >> 8);
      state_local.rw_mode = (uint8_t)irq_phase1;
      state_local._9_1_ = irq_phase1._1_1_;
      state_local.data = irq_phase1._2_1_;
      state_local.temp = irq_phase1._3_1_;
      state_local.A = (byte)was_halted;
      state_local.X = was_halted._1_1_;
      state_local.Y = was_halted._2_1_;
      state_local._15_1_ = was_halted._3_1_;
      local_10 = state_local.cycle;
      uStack_e = state_local.PC;
      bStack_c = state_local.S;
      bStack_b = state_local.P;
      uStack_a = state_local.address;
      break;
    case 10:
      bStack_c = uVar17 << 1;
      bVar23 = 2;
      if (bStack_c != 0) {
        bVar23 = 0;
      }
      _irq_phase1 = CONCAT26(uVar9,CONCAT15(bVar7 & 0x7c | (byte)((int)(uint)uVar17 >> 7) | 0x20 |
                                            bStack_c & 0x80 | bVar23,uVar3)) | 0x200000000000;
      state_local.rw_mode = (uint8_t)irq_phase1;
      state_local._9_1_ = irq_phase1._1_1_;
      state_local.data = irq_phase1._2_1_;
      state_local.temp = irq_phase1._3_1_;
      state_local.A = (byte)was_halted;
      state_local.X = was_halted._1_1_;
      state_local.Y = was_halted._2_1_;
      state_local._15_1_ = was_halted._3_1_;
      state_local.cycle = (uint16_t)uVar10;
      state_local.PC = SUB42(uVar10,2);
      state_local.P = (uint8_t)uVar19;
      state_local.address = SUB32(uVar19,1);
      local_10 = state_local.cycle;
      uStack_e = state_local.PC;
      bStack_b = state_local.P;
      uStack_a = state_local.address;
      break;
    case 0x18:
      _irq_phase1 = _irq_phase1 & 0xfffffeffffffffff | 0x200000000000;
      state_local.rw_mode = (uint8_t)irq_phase1;
      state_local._9_1_ = irq_phase1._1_1_;
      state_local.data = irq_phase1._2_1_;
      state_local.temp = irq_phase1._3_1_;
      state_local.A = (byte)was_halted;
      state_local.X = was_halted._1_1_;
      state_local.Y = was_halted._2_1_;
      state_local._15_1_ = was_halted._3_1_;
      state_local.cycle = (uint16_t)uVar13;
      state_local.PC = SUB82(uVar13,2);
      state_local.S = SUB81(uVar13,4);
      state_local.P = SUB81(uVar13,5);
      state_local.address = SUB82(uVar13,6);
      local_10 = state_local.cycle;
      uStack_e = state_local.PC;
      bStack_c = state_local.S;
      bStack_b = state_local.P;
      uStack_a = state_local.address;
      break;
    case 0x1a:
    case 0x3a:
    case 0x5a:
    case 0x7a:
    case 0xda:
    case 0xea:
    case 0xfa:
      irq_phase1._2_1_ = (uint8_t)uVar5;
      irq_phase1._3_1_ = SUB61(uVar5,1);
      was_halted._0_1_ = SUB61(uVar5,2);
      was_halted._1_1_ = SUB61(uVar5,3);
      was_halted._2_1_ = SUB61(uVar5,4);
      was_halted._3_1_ = SUB61(uVar5,5);
      state_local.data = irq_phase1._2_1_;
      state_local.temp = irq_phase1._3_1_;
      state_local.A = (byte)was_halted;
      state_local.X = was_halted._1_1_;
      state_local.Y = was_halted._2_1_;
      state_local._15_1_ = was_halted._3_1_;
      state_local.cycle = (uint16_t)uVar13;
      state_local.PC = SUB82(uVar13,2);
      state_local.S = SUB81(uVar13,4);
      state_local.P = SUB81(uVar13,5);
      state_local.address = SUB82(uVar13,6);
      local_10 = state_local.cycle;
      uStack_e = state_local.PC;
      bStack_c = state_local.S;
      bStack_b = state_local.P;
      uStack_a = state_local.address;
      break;
    case 0x28:
    case 0x68:
      state_local.cycle._0_1_ = 1;
      state_local._0_8_ = CONCAT71(uVar14,(uint8_t)state_local.cycle);
      was_halted._2_1_ = (uint8_t)uVar26;
      was_halted._3_1_ = (undefined1)(uVar26 >> 8);
      state_local.rw_mode = (uint8_t)irq_phase1;
      state_local._9_1_ = irq_phase1._1_1_;
      state_local.data = irq_phase1._2_1_;
      state_local.temp = irq_phase1._3_1_;
      state_local.A = (byte)was_halted;
      state_local.X = was_halted._1_1_;
      state_local.Y = was_halted._2_1_;
      state_local._15_1_ = was_halted._3_1_;
      state_local.PC = SUB72(uVar14,1);
      state_local.S = SUB71(uVar14,3);
      state_local.P = SUB71(uVar14,4);
      state_local.address = SUB72(uVar14,5);
      local_10 = state_local.cycle;
      uStack_e = state_local.PC;
      bStack_c = state_local.S;
      bStack_b = state_local.P;
      uStack_a = state_local.address;
      break;
    case 0x2a:
      bStack_c = uVar17 << 1 | bVar7 & 1;
      bVar23 = 2;
      if (bStack_c != 0) {
        bVar23 = 0;
      }
      _irq_phase1 = CONCAT26(uVar9,CONCAT15(bVar7 & 0x7c | (byte)((int)(uint)uVar17 >> 7) | 0x20 |
                                            uVar17 << 1 & 0x80 | bVar23,uVar3)) | 0x200000000000;
      state_local.rw_mode = (uint8_t)irq_phase1;
      state_local._9_1_ = irq_phase1._1_1_;
      state_local.data = irq_phase1._2_1_;
      state_local.temp = irq_phase1._3_1_;
      state_local.A = (byte)was_halted;
      state_local.X = was_halted._1_1_;
      state_local.Y = was_halted._2_1_;
      state_local._15_1_ = was_halted._3_1_;
      state_local.cycle = (uint16_t)uVar10;
      state_local.PC = SUB42(uVar10,2);
      state_local.P = (uint8_t)uVar19;
      state_local.address = SUB32(uVar19,1);
      local_10 = state_local.cycle;
      uStack_e = state_local.PC;
      bStack_b = state_local.P;
      uStack_a = state_local.address;
      break;
    case 0x38:
      _irq_phase1 = _irq_phase1 | 0x210000000000;
      state_local.rw_mode = (uint8_t)irq_phase1;
      state_local._9_1_ = irq_phase1._1_1_;
      state_local.data = irq_phase1._2_1_;
      state_local.temp = irq_phase1._3_1_;
      state_local.A = (byte)was_halted;
      state_local.X = was_halted._1_1_;
      state_local.Y = was_halted._2_1_;
      state_local._15_1_ = was_halted._3_1_;
      state_local.cycle = (uint16_t)uVar13;
      state_local.PC = SUB82(uVar13,2);
      state_local.S = SUB81(uVar13,4);
      state_local.P = SUB81(uVar13,5);
      state_local.address = SUB82(uVar13,6);
      local_10 = state_local.cycle;
      uStack_e = state_local.PC;
      bStack_c = state_local.S;
      bStack_b = state_local.P;
      uStack_a = state_local.address;
      break;
    case 0x48:
      state_local.cycle._0_1_ = 2;
      state_local._0_8_ = CONCAT71(uVar14,(uint8_t)state_local.cycle);
      _irq_phase1 = CONCAT14(bStack_b - 1,iVar2);
      _irq_phase1 = CONCAT35(uVar8,_irq_phase1);
      state_local.PC._0_1_ = uVar17;
      state_local._0_8_ = CONCAT53(uVar16,state_local._0_3_);
      was_halted._2_1_ = (uint8_t)(bStack_b + 0x100);
      was_halted._3_1_ = (undefined1)((ushort)(bStack_b + 0x100) >> 8);
      state_local.rw_mode = (uint8_t)irq_phase1;
      state_local._9_1_ = irq_phase1._1_1_;
      state_local.data = irq_phase1._2_1_;
      state_local.temp = irq_phase1._3_1_;
      state_local.A = (byte)was_halted;
      state_local.X = was_halted._1_1_;
      state_local.Y = was_halted._2_1_;
      state_local._15_1_ = was_halted._3_1_;
      state_local.S = SUB51(uVar16,1);
      state_local.P = SUB51(uVar16,2);
      state_local.address = SUB52(uVar16,3);
      local_10 = state_local.cycle;
      uStack_e = state_local.PC;
      bStack_c = state_local.S;
      bStack_b = state_local.P;
      uStack_a = state_local.address;
      break;
    case 0x4a:
      bStack_c = (byte)((int)(uint)uVar17 >> 1);
      bVar23 = 2;
      if (bStack_c != '\0') {
        bVar23 = 0;
      }
      _irq_phase1 = CONCAT26(uVar9,CONCAT15(bVar7 & 0x7c | uVar17 & 1 | 0x20 | bVar23,uVar3)) |
                    0x200000000000;
      state_local.rw_mode = (uint8_t)irq_phase1;
      state_local._9_1_ = irq_phase1._1_1_;
      state_local.data = irq_phase1._2_1_;
      state_local.temp = irq_phase1._3_1_;
      state_local.A = (byte)was_halted;
      state_local.X = was_halted._1_1_;
      state_local.Y = was_halted._2_1_;
      state_local._15_1_ = was_halted._3_1_;
      state_local.cycle = (uint16_t)uVar10;
      state_local.PC = SUB42(uVar10,2);
      state_local.P = (uint8_t)uVar19;
      state_local.address = SUB32(uVar19,1);
      local_10 = state_local.cycle;
      uStack_e = state_local.PC;
      bStack_b = state_local.P;
      uStack_a = state_local.address;
      break;
    case 0x58:
      _irq_phase1 = _irq_phase1 & 0xfffffbffffffffff | 0x200000000000;
      state_local.rw_mode = (uint8_t)irq_phase1;
      state_local._9_1_ = irq_phase1._1_1_;
      state_local.data = irq_phase1._2_1_;
      state_local.temp = irq_phase1._3_1_;
      state_local.A = (byte)was_halted;
      state_local.X = was_halted._1_1_;
      state_local.Y = was_halted._2_1_;
      state_local._15_1_ = was_halted._3_1_;
      state_local.cycle = (uint16_t)uVar13;
      state_local.PC = SUB82(uVar13,2);
      state_local.S = SUB81(uVar13,4);
      state_local.P = SUB81(uVar13,5);
      state_local.address = SUB82(uVar13,6);
      local_10 = state_local.cycle;
      uStack_e = state_local.PC;
      bStack_c = state_local.S;
      bStack_b = state_local.P;
      uStack_a = state_local.address;
      break;
    case 0x6a:
      bStack_c = (byte)((int)(uint)uVar17 >> 1) | bVar7 << 7;
      bVar23 = 2;
      if (bStack_c != 0) {
        bVar23 = 0;
      }
      _irq_phase1 = CONCAT26(uVar9,CONCAT15(bVar7 & 0x7c | uVar17 & 1 | 0x20 | bVar7 << 7 | bVar23,
                                            uVar3)) | 0x200000000000;
      state_local.rw_mode = (uint8_t)irq_phase1;
      state_local._9_1_ = irq_phase1._1_1_;
      state_local.data = irq_phase1._2_1_;
      state_local.temp = irq_phase1._3_1_;
      state_local.A = (byte)was_halted;
      state_local.X = was_halted._1_1_;
      state_local.Y = was_halted._2_1_;
      state_local._15_1_ = was_halted._3_1_;
      state_local.cycle = (uint16_t)uVar10;
      state_local.PC = SUB42(uVar10,2);
      state_local.P = (uint8_t)uVar19;
      state_local.address = SUB32(uVar19,1);
      local_10 = state_local.cycle;
      uStack_e = state_local.PC;
      bStack_b = state_local.P;
      uStack_a = state_local.address;
      break;
    case 0x78:
      _irq_phase1 = _irq_phase1 | 0x240000000000;
      state_local.rw_mode = (uint8_t)irq_phase1;
      state_local._9_1_ = irq_phase1._1_1_;
      state_local.data = irq_phase1._2_1_;
      state_local.temp = irq_phase1._3_1_;
      state_local.A = (byte)was_halted;
      state_local.X = was_halted._1_1_;
      state_local.Y = was_halted._2_1_;
      state_local._15_1_ = was_halted._3_1_;
      state_local.cycle = (uint16_t)uVar13;
      state_local.PC = SUB82(uVar13,2);
      state_local.S = SUB81(uVar13,4);
      state_local.P = SUB81(uVar13,5);
      state_local.address = SUB82(uVar13,6);
      local_10 = state_local.cycle;
      uStack_e = state_local.PC;
      bStack_c = state_local.S;
      bStack_b = state_local.P;
      uStack_a = state_local.address;
      break;
    case 0x88:
      state_local.address._0_1_ = bStack_c - 1;
      state_local._0_8_ = CONCAT17(uVar20,state_local._0_7_);
      uVar12 = state_local._0_8_;
      bVar23 = 2;
      if ((byte)state_local.address != 0) {
        bVar23 = 0;
      }
      _irq_phase1 = CONCAT26(uVar9,CONCAT15(bVar7 & 0x7d | (byte)state_local.address & 0x80 | bVar23
                                            ,uVar3)) | 0x200000000000;
      state_local.rw_mode = (uint8_t)irq_phase1;
      state_local._9_1_ = irq_phase1._1_1_;
      state_local.data = irq_phase1._2_1_;
      state_local.temp = irq_phase1._3_1_;
      state_local.A = (byte)was_halted;
      state_local.X = was_halted._1_1_;
      state_local.Y = was_halted._2_1_;
      state_local._15_1_ = was_halted._3_1_;
      state_local.address = SUB82(uVar12,6);
      local_10 = state_local.cycle;
      uStack_e = state_local.PC;
      bStack_c = state_local.S;
      bStack_b = state_local.P;
      uStack_a = state_local.address;
      break;
    case 0x8a:
      bVar23 = 2;
      if (uVar18 != '\0') {
        bVar23 = 0;
      }
      _irq_phase1 = CONCAT26(uVar9,CONCAT15(bVar7 & 0x7d | uVar18 & 0x80 | bVar23,uVar3)) |
                    0x200000000000;
      state_local.rw_mode = (uint8_t)irq_phase1;
      state_local._9_1_ = irq_phase1._1_1_;
      state_local.data = irq_phase1._2_1_;
      state_local.temp = irq_phase1._3_1_;
      state_local.A = (byte)was_halted;
      state_local.X = was_halted._1_1_;
      state_local.Y = was_halted._2_1_;
      state_local._15_1_ = was_halted._3_1_;
      state_local.cycle = (uint16_t)uVar10;
      state_local.PC = SUB42(uVar10,2);
      state_local.P = (uint8_t)uVar19;
      state_local.address = SUB32(uVar19,1);
      local_10 = state_local.cycle;
      uStack_e = state_local.PC;
      bStack_c = uVar18;
      bStack_b = state_local.P;
      uStack_a = state_local.address;
      break;
    case 0x98:
      bVar23 = 2;
      if (bStack_c != 0) {
        bVar23 = 0;
      }
      _irq_phase1 = CONCAT26(uVar9,CONCAT15(bVar7 & 0x7d | bStack_c & 0x80 | bVar23,uVar3)) |
                    0x200000000000;
      state_local.rw_mode = (uint8_t)irq_phase1;
      state_local._9_1_ = irq_phase1._1_1_;
      state_local.data = irq_phase1._2_1_;
      state_local.temp = irq_phase1._3_1_;
      state_local.A = (byte)was_halted;
      state_local.X = was_halted._1_1_;
      state_local.Y = was_halted._2_1_;
      state_local._15_1_ = was_halted._3_1_;
      state_local.cycle = (uint16_t)uVar10;
      state_local.PC = SUB42(uVar10,2);
      state_local.P = (uint8_t)uVar19;
      state_local.address = SUB32(uVar19,1);
      local_10 = state_local.cycle;
      uStack_e = state_local.PC;
      bStack_b = state_local.P;
      uStack_a = state_local.address;
      break;
    case 0x9a:
      irq_phase1._0_1_ = (uint8_t)iVar2;
      irq_phase1._1_1_ = SUB41(iVar2,1);
      irq_phase1._2_1_ = SUB41(iVar2,2);
      irq_phase1._3_1_ = SUB41(iVar2,3);
      was_halted._1_1_ = (byte)uVar8;
      was_halted._2_1_ = SUB31(uVar8,1);
      was_halted._3_1_ = SUB31(uVar8,2);
      state_local.rw_mode = (uint8_t)irq_phase1;
      state_local._9_1_ = irq_phase1._1_1_;
      state_local.data = irq_phase1._2_1_;
      state_local.temp = irq_phase1._3_1_;
      state_local.A = uVar18;
      state_local.X = was_halted._1_1_;
      state_local.Y = was_halted._2_1_;
      state_local._15_1_ = was_halted._3_1_;
      state_local.cycle = (uint16_t)uVar13;
      state_local.PC = SUB82(uVar13,2);
      state_local.S = SUB81(uVar13,4);
      state_local.P = SUB81(uVar13,5);
      state_local.address = SUB82(uVar13,6);
      local_10 = state_local.cycle;
      uStack_e = state_local.PC;
      bStack_c = state_local.S;
      bStack_b = state_local.P;
      uStack_a = state_local.address;
      break;
    case 0xa8:
      state_local.address._0_1_ = uVar17;
      state_local._0_8_ = CONCAT17(uVar20,state_local._0_7_);
      uVar12 = state_local._0_8_;
      bVar23 = 2;
      if (uVar17 != '\0') {
        bVar23 = 0;
      }
      _irq_phase1 = CONCAT26(uVar9,CONCAT15(bVar7 & 0x7d | uVar17 & 0x80 | bVar23,uVar3)) |
                    0x200000000000;
      state_local.rw_mode = (uint8_t)irq_phase1;
      state_local._9_1_ = irq_phase1._1_1_;
      state_local.data = irq_phase1._2_1_;
      state_local.temp = irq_phase1._3_1_;
      state_local.A = (byte)was_halted;
      state_local.X = was_halted._1_1_;
      state_local.Y = was_halted._2_1_;
      state_local._15_1_ = was_halted._3_1_;
      state_local.address = SUB82(uVar12,6);
      local_10 = state_local.cycle;
      uStack_e = state_local.PC;
      bStack_c = state_local.S;
      bStack_b = state_local.P;
      uStack_a = state_local.address;
      break;
    case 0xaa:
      bVar23 = 2;
      if (uVar17 != '\0') {
        bVar23 = 0;
      }
      _irq_phase1 = CONCAT26(uVar9,CONCAT15(bVar7 & 0x7d | uVar17 & 0x80 | bVar23,uVar3)) |
                    0x200000000000;
      state_local.rw_mode = (uint8_t)irq_phase1;
      state_local._9_1_ = irq_phase1._1_1_;
      state_local.data = irq_phase1._2_1_;
      state_local.temp = irq_phase1._3_1_;
      state_local.A = (byte)was_halted;
      state_local.X = was_halted._1_1_;
      state_local.Y = was_halted._2_1_;
      state_local._15_1_ = was_halted._3_1_;
      state_local.cycle = (uint16_t)uVar11;
      state_local.PC = SUB52(uVar11,2);
      state_local.S = SUB51(uVar11,4);
      local_10 = state_local.cycle;
      uStack_e = state_local.PC;
      bStack_c = state_local.S;
      bStack_b = uVar17;
      uStack_a = state_local.address;
      break;
    case 0xb8:
      _irq_phase1 = _irq_phase1 & 0xffffbfffffffffff | 0x200000000000;
      state_local.rw_mode = (uint8_t)irq_phase1;
      state_local._9_1_ = irq_phase1._1_1_;
      state_local.data = irq_phase1._2_1_;
      state_local.temp = irq_phase1._3_1_;
      state_local.A = (byte)was_halted;
      state_local.X = was_halted._1_1_;
      state_local.Y = was_halted._2_1_;
      state_local._15_1_ = was_halted._3_1_;
      state_local.cycle = (uint16_t)uVar13;
      state_local.PC = SUB82(uVar13,2);
      state_local.S = SUB81(uVar13,4);
      state_local.P = SUB81(uVar13,5);
      state_local.address = SUB82(uVar13,6);
      local_10 = state_local.cycle;
      uStack_e = state_local.PC;
      bStack_c = state_local.S;
      bStack_b = state_local.P;
      uStack_a = state_local.address;
      break;
    case 0xba:
      bVar23 = 2;
      if (bStack_b != 0) {
        bVar23 = 0;
      }
      _irq_phase1 = CONCAT26(uVar9,CONCAT15(bVar7 & 0x7d | bStack_b & 0x80 | bVar23,uVar3)) |
                    0x200000000000;
      state_local.rw_mode = (uint8_t)irq_phase1;
      state_local._9_1_ = irq_phase1._1_1_;
      state_local.data = irq_phase1._2_1_;
      state_local.temp = irq_phase1._3_1_;
      state_local.A = (byte)was_halted;
      state_local.X = was_halted._1_1_;
      state_local.Y = was_halted._2_1_;
      state_local._15_1_ = was_halted._3_1_;
      state_local.cycle = (uint16_t)uVar11;
      state_local.PC = SUB52(uVar11,2);
      state_local.S = SUB51(uVar11,4);
      local_10 = state_local.cycle;
      uStack_e = state_local.PC;
      bStack_c = state_local.S;
      uStack_a = state_local.address;
      break;
    case 200:
      state_local.address._0_1_ = bStack_c + 1;
      state_local._0_8_ = CONCAT17(uVar20,state_local._0_7_);
      uVar12 = state_local._0_8_;
      bVar23 = 2;
      if ((byte)state_local.address != 0) {
        bVar23 = 0;
      }
      _irq_phase1 = CONCAT26(uVar9,CONCAT15(bVar7 & 0x7d | (byte)state_local.address & 0x80 | bVar23
                                            ,uVar3)) | 0x200000000000;
      state_local.rw_mode = (uint8_t)irq_phase1;
      state_local._9_1_ = irq_phase1._1_1_;
      state_local.data = irq_phase1._2_1_;
      state_local.temp = irq_phase1._3_1_;
      state_local.A = (byte)was_halted;
      state_local.X = was_halted._1_1_;
      state_local.Y = was_halted._2_1_;
      state_local._15_1_ = was_halted._3_1_;
      state_local.address = SUB82(uVar12,6);
      local_10 = state_local.cycle;
      uStack_e = state_local.PC;
      bStack_c = state_local.S;
      bStack_b = state_local.P;
      uStack_a = state_local.address;
      break;
    case 0xca:
      bStack_b = uVar18 - 1;
      bVar23 = 2;
      if (bStack_b != 0) {
        bVar23 = 0;
      }
      _irq_phase1 = CONCAT26(uVar9,CONCAT15(bVar7 & 0x7d | bStack_b & 0x80 | bVar23,uVar3)) |
                    0x200000000000;
      state_local.rw_mode = (uint8_t)irq_phase1;
      state_local._9_1_ = irq_phase1._1_1_;
      state_local.data = irq_phase1._2_1_;
      state_local.temp = irq_phase1._3_1_;
      state_local.A = (byte)was_halted;
      state_local.X = was_halted._1_1_;
      state_local.Y = was_halted._2_1_;
      state_local._15_1_ = was_halted._3_1_;
      state_local.cycle = (uint16_t)uVar11;
      state_local.PC = SUB52(uVar11,2);
      state_local.S = SUB51(uVar11,4);
      local_10 = state_local.cycle;
      uStack_e = state_local.PC;
      bStack_c = state_local.S;
      uStack_a = state_local.address;
      break;
    case 0xd8:
      _irq_phase1 = _irq_phase1 & 0xfffff7ffffffffff | 0x200000000000;
      state_local.rw_mode = (uint8_t)irq_phase1;
      state_local._9_1_ = irq_phase1._1_1_;
      state_local.data = irq_phase1._2_1_;
      state_local.temp = irq_phase1._3_1_;
      state_local.A = (byte)was_halted;
      state_local.X = was_halted._1_1_;
      state_local.Y = was_halted._2_1_;
      state_local._15_1_ = was_halted._3_1_;
      state_local.cycle = (uint16_t)uVar13;
      state_local.PC = SUB82(uVar13,2);
      state_local.S = SUB81(uVar13,4);
      state_local.P = SUB81(uVar13,5);
      state_local.address = SUB82(uVar13,6);
      local_10 = state_local.cycle;
      uStack_e = state_local.PC;
      bStack_c = state_local.S;
      bStack_b = state_local.P;
      uStack_a = state_local.address;
      break;
    case 0xe8:
      bStack_b = uVar18 + 1;
      bVar23 = 2;
      if (bStack_b != 0) {
        bVar23 = 0;
      }
      _irq_phase1 = CONCAT26(uVar9,CONCAT15(bVar7 & 0x7d | bStack_b & 0x80 | bVar23,uVar3)) |
                    0x200000000000;
      state_local.rw_mode = (uint8_t)irq_phase1;
      state_local._9_1_ = irq_phase1._1_1_;
      state_local.data = irq_phase1._2_1_;
      state_local.temp = irq_phase1._3_1_;
      state_local.A = (byte)was_halted;
      state_local.X = was_halted._1_1_;
      state_local.Y = was_halted._2_1_;
      state_local._15_1_ = was_halted._3_1_;
      state_local.cycle = (uint16_t)uVar11;
      state_local.PC = SUB52(uVar11,2);
      state_local.S = SUB51(uVar11,4);
      local_10 = state_local.cycle;
      uStack_e = state_local.PC;
      bStack_c = state_local.S;
      uStack_a = state_local.address;
      break;
    case 0xf8:
      _irq_phase1 = _irq_phase1 | 0x280000000000;
      state_local.rw_mode = (uint8_t)irq_phase1;
      state_local._9_1_ = irq_phase1._1_1_;
      state_local.data = irq_phase1._2_1_;
      state_local.temp = irq_phase1._3_1_;
      state_local.A = (byte)was_halted;
      state_local.X = was_halted._1_1_;
      state_local.Y = was_halted._2_1_;
      state_local._15_1_ = was_halted._3_1_;
      state_local.cycle = (uint16_t)uVar13;
      state_local.PC = SUB82(uVar13,2);
      state_local.S = SUB81(uVar13,4);
      state_local.P = SUB81(uVar13,5);
      state_local.address = SUB82(uVar13,6);
      local_10 = state_local.cycle;
      uStack_e = state_local.PC;
      bStack_c = state_local.S;
      bStack_b = state_local.P;
      uStack_a = state_local.address;
    }
  }
  else {
    irq_phase1 = (int)uVar21;
    if (cVar24 == '\x01') {
      state_local._0_8_ = (ulong)(uint7)uVar14 << 8;
      if (uVar27 < 0x100) {
        state_local.cycle._0_1_ = 2;
        state_local._0_8_ = CONCAT71(uVar14,(uint8_t)state_local.cycle);
        state_local.PC._0_1_ = state.PC._1_1_;
        state_local._0_8_ = CONCAT53(uVar16,state_local._0_3_);
        _irq_phase1 = CONCAT14(bStack_b - 1,irq_phase1);
        _irq_phase1 = CONCAT35(uVar8,_irq_phase1);
        was_halted._2_1_ = (uint8_t)(bStack_b + 0x100);
        was_halted._3_1_ = (undefined1)((ushort)(bStack_b + 0x100) >> 8);
        state_local.rw_mode = (uint8_t)irq_phase1;
        state_local._9_1_ = irq_phase1._1_1_;
        state_local.data = irq_phase1._2_1_;
        state_local.temp = irq_phase1._3_1_;
        state_local.A = (byte)was_halted;
        state_local.X = was_halted._1_1_;
        state_local.Y = was_halted._2_1_;
        state_local._15_1_ = was_halted._3_1_;
        state_local.S = SUB51(uVar16,1);
        state_local.P = SUB51(uVar16,2);
        state_local.address = SUB52(uVar16,3);
        local_10 = state_local.cycle;
        uStack_e = state_local.PC;
        bStack_c = state_local.S;
        bStack_b = state_local.P;
        uStack_a = state_local.address;
        goto LAB_0010df74;
      }
    }
    else if (cVar24 == '\x02') {
      if (uVar27 < 0x100) {
        state_local.PC._0_1_ = (char)state.PC;
        state_local._0_8_ = CONCAT53(uVar16,state_local._0_3_);
        _irq_phase1 = CONCAT14(bStack_b - 1,irq_phase1);
        _irq_phase1 = CONCAT35(uVar8,_irq_phase1);
        was_halted._2_1_ = (uint8_t)(bStack_b + 0x100);
        was_halted._3_1_ = (undefined1)((ushort)(bStack_b + 0x100) >> 8);
        state_local.rw_mode = (uint8_t)irq_phase1;
        state_local._9_1_ = irq_phase1._1_1_;
        state_local.data = irq_phase1._2_1_;
        state_local.temp = irq_phase1._3_1_;
        state_local.A = (byte)was_halted;
        state_local.X = was_halted._1_1_;
        state_local.Y = was_halted._2_1_;
        state_local._15_1_ = was_halted._3_1_;
        state_local.S = SUB51(uVar16,1);
        state_local.P = SUB51(uVar16,2);
        state_local.address = SUB52(uVar16,3);
        local_10 = state_local.cycle;
        uStack_e = state_local.PC;
        bStack_c = state_local.S;
        bStack_b = state_local.P;
        uStack_a = state_local.address;
        goto LAB_0010df74;
      }
    }
    else if (cVar24 == '\x03') {
      if (uVar27 < 0x100) {
        state_local.PC._0_1_ = bVar7;
        state_local._0_8_ = CONCAT53(uVar16,state_local._0_3_);
        if ((cVar15 == '\0') || (cVar15 == -4)) {
          state_local._0_8_ = CONCAT53(uVar16,state_local._0_3_) | 0x100000;
        }
        if ((state_local.cycle._1_1_ >> 5 & 1) == 0) {
          if (((state_local.cycle._1_1_ >> 4 & 1) != 0) || (state_local.PC._1_1_ == '\0')) {
            state_local.PC._1_1_ = 0xfe;
          }
        }
        else {
          state_local._0_8_ = state_local._0_8_ & 0xffffffffffffd7ff;
          state_local.PC._1_1_ = 0xfa;
        }
        _irq_phase1 = CONCAT14(bStack_b - 1,irq_phase1);
        _irq_phase1 = CONCAT35(uVar8,_irq_phase1);
        was_halted._2_1_ = (uint8_t)(bStack_b + 0x100);
        was_halted._3_1_ = (undefined1)((ushort)(bStack_b + 0x100) >> 8);
        state_local.rw_mode = (uint8_t)irq_phase1;
        state_local._9_1_ = irq_phase1._1_1_;
        state_local.data = irq_phase1._2_1_;
        state_local.temp = irq_phase1._3_1_;
        state_local.A = (byte)was_halted;
        state_local.X = was_halted._1_1_;
        state_local.Y = was_halted._2_1_;
        state_local._15_1_ = was_halted._3_1_;
        local_10 = state_local.cycle;
        uStack_e = state_local.PC;
        bStack_c = state_local.S;
        bStack_b = state_local.P;
        uStack_a = state_local.address;
        goto LAB_0010df74;
      }
    }
    else if (cVar24 == '\x04') {
      state_local._0_8_ = (ulong)(uint7)uVar14 << 8;
      if (uVar27 < 0x100) {
        state_local.cycle._0_1_ = 1;
        state_local._0_8_ = CONCAT71(uVar14,(uint8_t)state_local.cycle);
        _irq_phase1 = (int6)uVar21;
        _irq_phase1 = (ulong)CONCAT16(cVar15,_irq_phase1) | 0xff00240000000000;
        state_local.rw_mode = (uint8_t)irq_phase1;
        state_local._9_1_ = irq_phase1._1_1_;
        state_local.data = irq_phase1._2_1_;
        state_local.temp = irq_phase1._3_1_;
        state_local.A = (byte)was_halted;
        state_local.X = was_halted._1_1_;
        state_local.Y = was_halted._2_1_;
        state_local._15_1_ = was_halted._3_1_;
        state_local.PC = SUB72(uVar14,1);
        state_local.S = SUB71(uVar14,3);
        state_local.P = SUB71(uVar14,4);
        state_local.address = SUB72(uVar14,5);
        local_10 = state_local.cycle;
        uStack_e = state_local.PC;
        bStack_c = state_local.S;
        bStack_b = state_local.P;
        uStack_a = state_local.address;
        goto LAB_0010df74;
      }
    }
    else if (cVar24 == '\x05') {
      state_local._0_8_ = (ulong)(uint7)uVar14 << 8;
      if (uVar27 < 0x100) {
        state_local.cycle._0_1_ = 1;
        state_local._0_8_ = CONCAT71(uVar14,(uint8_t)state_local.cycle);
        irq_phase1 = (int)CONCAT12(state_local._9_1_,uVar28);
        was_halted._2_1_ = (uint8_t)(uVar9 + 1);
        was_halted._3_1_ = (undefined1)((ushort)(uVar9 + 1) >> 8);
        state_local.rw_mode = (uint8_t)irq_phase1;
        state_local._9_1_ = irq_phase1._1_1_;
        state_local.data = irq_phase1._2_1_;
        state_local.temp = irq_phase1._3_1_;
        state_local.A = (byte)was_halted;
        state_local.X = was_halted._1_1_;
        state_local.Y = was_halted._2_1_;
        state_local._15_1_ = was_halted._3_1_;
        state_local.PC = SUB72(uVar14,1);
        state_local.S = SUB71(uVar14,3);
        state_local.P = SUB71(uVar14,4);
        state_local.address = SUB72(uVar14,5);
        local_10 = state_local.cycle;
        uStack_e = state_local.PC;
        bStack_c = state_local.S;
        bStack_b = state_local.P;
        uStack_a = state_local.address;
        goto LAB_0010df74;
      }
    }
    else if (cVar24 == '\x06') {
      if (uVar27 == 0) {
        _irq_phase1 = (ulong)CONCAT42(was_halted,(ushort)(byte)state_local._9_1_ << 8 | uVar26) <<
                      0x10;
        bVar23 = 0;
        uVar21 = _irq_phase1;
      }
      else {
        _irq_phase1 = (undefined5)uVar21;
        if ((uVar27 == 3) || (uVar27 == 0x13)) {
          state_local.cycle._0_1_ = 2;
          state_local._0_8_ = CONCAT71(uVar14,(uint8_t)state_local.cycle);
          state_local.PC._0_1_ = state_local._9_1_ << 1;
          state_local._0_8_ = CONCAT53(uVar16,state_local._0_3_);
          bStack_c = uVar17 | state_local._9_1_ << 1;
          bVar23 = 2;
          if (bStack_c != 0) {
            bVar23 = 0;
          }
          _irq_phase1 = CONCAT26(uVar9,CONCAT15(bVar7 & 0x7c |
                                                (byte)((int)(uint)(byte)state_local._9_1_ >> 7) |
                                                0x20 | bStack_c & 0x80 | bVar23,_irq_phase1)) |
                        0x200000000000;
          state_local.rw_mode = (uint8_t)irq_phase1;
          state_local._9_1_ = irq_phase1._1_1_;
          state_local.data = irq_phase1._2_1_;
          state_local.temp = irq_phase1._3_1_;
          state_local.A = (byte)was_halted;
          state_local.X = was_halted._1_1_;
          state_local.Y = was_halted._2_1_;
          state_local._15_1_ = was_halted._3_1_;
          state_local.P = (uint8_t)uVar19;
          state_local.address = SUB32(uVar19,1);
          local_10 = state_local.cycle;
          uStack_e = state_local.PC;
          bStack_b = state_local.P;
          uStack_a = state_local.address;
          goto LAB_0010df74;
        }
        if ((uVar27 == 0x23) || (uVar27 == 0x33)) {
          state_local.cycle._0_1_ = 2;
          state_local._0_8_ = CONCAT71(uVar14,(uint8_t)state_local.cycle);
          bStack_c = state_local._9_1_ << 1 | bVar7 & 1;
          state_local.PC._0_1_ = bStack_c;
          state_local._0_8_ = CONCAT53(uVar16,state_local._0_3_);
          bStack_c = uVar17 & bStack_c;
          bVar23 = 2;
          if (bStack_c != 0) {
            bVar23 = 0;
          }
          _irq_phase1 = CONCAT26(uVar9,CONCAT15(bVar7 & 0x7c |
                                                (byte)((int)(uint)(byte)state_local._9_1_ >> 7) |
                                                0x20 | bStack_c & 0x80 | bVar23,_irq_phase1)) |
                        0x200000000000;
          state_local.rw_mode = (uint8_t)irq_phase1;
          state_local._9_1_ = irq_phase1._1_1_;
          state_local.data = irq_phase1._2_1_;
          state_local.temp = irq_phase1._3_1_;
          state_local.A = (byte)was_halted;
          state_local.X = was_halted._1_1_;
          state_local.Y = was_halted._2_1_;
          state_local._15_1_ = was_halted._3_1_;
          state_local.P = (uint8_t)uVar19;
          state_local.address = SUB32(uVar19,1);
          local_10 = state_local.cycle;
          uStack_e = state_local.PC;
          bStack_b = state_local.P;
          uStack_a = state_local.address;
          goto LAB_0010df74;
        }
        if ((uVar27 == 0x43) || (uVar27 == 0x53)) {
          state_local.cycle._0_1_ = 2;
          state_local._0_8_ = CONCAT71(uVar14,(uint8_t)state_local.cycle);
          bStack_c = (byte)((int)(uint)(byte)state_local._9_1_ >> 1);
          state_local.PC._0_1_ = bStack_c;
          state_local._0_8_ = CONCAT53(uVar16,state_local._0_3_);
          bStack_c = uVar17 ^ bStack_c;
          bVar23 = 2;
          if (bStack_c != 0) {
            bVar23 = 0;
          }
          _irq_phase1 = CONCAT26(uVar9,CONCAT15(bVar7 & 0x7c | state_local._9_1_ & 1 | 0x20 |
                                                bStack_c & 0x80 | bVar23,_irq_phase1)) |
                        0x200000000000;
          state_local.rw_mode = (uint8_t)irq_phase1;
          state_local._9_1_ = irq_phase1._1_1_;
          state_local.data = irq_phase1._2_1_;
          state_local.temp = irq_phase1._3_1_;
          state_local.A = (byte)was_halted;
          state_local.X = was_halted._1_1_;
          state_local.Y = was_halted._2_1_;
          state_local._15_1_ = was_halted._3_1_;
          state_local.P = (uint8_t)uVar19;
          state_local.address = SUB32(uVar19,1);
          local_10 = state_local.cycle;
          uStack_e = state_local.PC;
          bStack_b = state_local.P;
          uStack_a = state_local.address;
          goto LAB_0010df74;
        }
        if ((uVar27 == 99) || (uVar27 == 0x73)) {
          state_local.cycle._0_1_ = 2;
          state_local._0_8_ = CONCAT71(uVar14,(uint8_t)state_local.cycle);
          bVar23 = (byte)((int)(uint)(byte)state_local._9_1_ >> 1) | bVar7 << 7;
          state_local.PC._0_1_ = bVar23;
          state_local._0_8_ = CONCAT53(uVar16,state_local._0_3_);
          uVar26 = (ushort)uVar17 + (ushort)bVar23 + (ushort)(state_local._9_1_ & 1);
          bVar22 = 2;
          if ((uint8_t)uVar26 != '\0') {
            bVar22 = 0;
          }
          _irq_phase1 = CONCAT26(uVar9,CONCAT15(bVar7 & 0x3c | 0x20 | (byte)((uVar26 & 0x180) >> 8)
                                                | (byte)((int)(((uint)bVar23 ^ (uint)uVar26) &
                                                               ((uint)uVar17 ^ (uint)uVar26) & 0x80)
                                                        >> 1) | 0x20 |
                                                (byte)(uVar26 & 0x180) | bVar22,_irq_phase1)) |
                        0x200000000000;
          state_local.rw_mode = (uint8_t)irq_phase1;
          state_local._9_1_ = irq_phase1._1_1_;
          state_local.data = irq_phase1._2_1_;
          state_local.temp = irq_phase1._3_1_;
          state_local.A = (byte)was_halted;
          state_local.X = was_halted._1_1_;
          state_local.Y = was_halted._2_1_;
          state_local._15_1_ = was_halted._3_1_;
          state_local.P = (uint8_t)uVar19;
          state_local.address = SUB32(uVar19,1);
          local_10 = state_local.cycle;
          uStack_e = state_local.PC;
          bStack_c = (uint8_t)uVar26;
          bStack_b = state_local.P;
          uStack_a = state_local.address;
          goto LAB_0010df74;
        }
        if ((uVar27 == 0xc3) || (uVar27 == 0xd3)) {
          state_local.cycle._0_1_ = 2;
          state_local._0_8_ = CONCAT71(uVar14,(uint8_t)state_local.cycle);
          state_local.PC._0_1_ = state_local._9_1_ - 1;
          state_local._0_8_ = CONCAT53(uVar16,state_local._0_3_);
          uVar26 = (ushort)uVar17 - (ushort)(byte)(state_local._9_1_ - 1);
          bVar23 = 2;
          if ((uVar26 & 0xff) != 0) {
            bVar23 = 0;
          }
          _irq_phase1 = CONCAT26(uVar9,CONCAT15(bVar7 & 0x7c | (byte)uVar26 & 0x80 | bVar23 | 0x20 |
                                                ((byte)(uVar26 >> 8) ^ 0xff) & 1,_irq_phase1)) |
                        0x200000000000;
          state_local.rw_mode = (uint8_t)irq_phase1;
          state_local._9_1_ = irq_phase1._1_1_;
          state_local.data = irq_phase1._2_1_;
          state_local.temp = irq_phase1._3_1_;
          state_local.A = (byte)was_halted;
          state_local.X = was_halted._1_1_;
          state_local.Y = was_halted._2_1_;
          state_local._15_1_ = was_halted._3_1_;
          state_local.S = SUB51(uVar16,1);
          state_local.P = SUB51(uVar16,2);
          state_local.address = SUB52(uVar16,3);
          local_10 = state_local.cycle;
          uStack_e = state_local.PC;
          bStack_c = state_local.S;
          bStack_b = state_local.P;
          uStack_a = state_local.address;
          goto LAB_0010df74;
        }
        if ((uVar27 == 0xe3) || (uVar27 == 0xf3)) {
          state_local.cycle._0_1_ = 2;
          state_local._0_8_ = CONCAT71(uVar14,(uint8_t)state_local.cycle);
          bVar23 = state_local._9_1_ + 1;
          state_local.PC._0_1_ = bVar23;
          state_local._0_8_ = CONCAT53(uVar16,state_local._0_3_);
          uVar26 = (ushort)uVar17 + (bVar23 ^ 0xffff) + (bVar7 & 1);
          bStack_c = (byte)uVar26;
          bVar22 = 2;
          if (bStack_c != 0) {
            bVar22 = 0;
          }
          _irq_phase1 = CONCAT26(uVar9,CONCAT15(bVar7 & 0x3c | ((byte)(uVar26 >> 8) ^ 0xff) & 1 |
                                                (byte)((int)((bVar23 ^ 0xffffffff ^ (uint)uVar26) &
                                                             ((uint)uVar17 ^ (uint)uVar26) & 0x80)
                                                      >> 1) | 0x20 | bStack_c & 0x80 | bVar22,
                                                _irq_phase1)) | 0x200000000000;
          state_local.rw_mode = (uint8_t)irq_phase1;
          state_local._9_1_ = irq_phase1._1_1_;
          state_local.data = irq_phase1._2_1_;
          state_local.temp = irq_phase1._3_1_;
          state_local.A = (byte)was_halted;
          state_local.X = was_halted._1_1_;
          state_local.Y = was_halted._2_1_;
          state_local._15_1_ = was_halted._3_1_;
          state_local.P = (uint8_t)uVar19;
          state_local.address = SUB32(uVar19,1);
          local_10 = state_local.cycle;
          uStack_e = state_local.PC;
          bStack_b = state_local.P;
          uStack_a = state_local.address;
          goto LAB_0010df74;
        }
      }
    }
    _irq_phase1 = uVar21;
    uVar14 = state_local._1_7_;
    uVar10 = state_local._4_4_;
    if ((bVar23 == 0) && ((bVar22 & 1) == 0)) {
      state_local.cycle._0_1_ = 1;
      state_local._0_8_ = CONCAT71(uVar14,(uint8_t)state_local.cycle);
      sVar4 = irq_phase1._2_2_;
      _irq_phase1 = CONCAT42(was_halted,irq_phase1._2_2_ + 1) << 0x10;
      _irq_phase1 = CONCAT26(sVar4,_irq_phase1);
      state_local.PC._1_1_ = 0;
    }
    else {
      state_local.cycle = state_local._1_2_ << 8;
      state_local.PC._0_1_ = 0;
      state_local.PC._1_1_ = 0xfe;
    }
    _irq_phase1 = _irq_phase1 & 0xffffffffffff0000;
    state_local.rw_mode = (uint8_t)irq_phase1;
    state_local._9_1_ = irq_phase1._1_1_;
    state_local.data = irq_phase1._2_1_;
    state_local.temp = irq_phase1._3_1_;
    state_local.A = (byte)was_halted;
    state_local.X = was_halted._1_1_;
    state_local.Y = was_halted._2_1_;
    state_local._15_1_ = was_halted._3_1_;
    state_local.S = (uint8_t)uVar10;
    state_local.P = SUB41(uVar10,1);
    state_local.address = SUB42(uVar10,2);
    local_10 = state_local.cycle;
    uStack_e = state_local.PC;
    bStack_c = state_local.S;
    bStack_b = state_local.P;
    uStack_a = state_local.address;
  }
LAB_0010df74:
  cVar1._8_8_ = _local_10;
  cVar1._0_8_ = state_local._8_8_;
  return cVar1;
}

Assistant:

static cpu_state cpu_execute(cpu_state state)
{
    if (!state.rdy && state.rw_mode != CPU_RW_MODE_WRITE)
    {
        state.halted = 1;
        return state;
    }

    int was_halted = state.halted;
    state.halted = 0;

    int irq_phase1 = state.irq_phase0;
    state.irq_phase0 = state.irq && !(state.P & CPU_STATUS_FLAG_IRQDISABLE);

    int nmi_phase1 = state.nmi_phase0;
    if (state.nmi_phase0 == 0 && state.nmi)
        state.nmi_phase0 = 1;

    uint8_t cycle = (uint8_t)state.cycle++;
    uint_fast32_t instruction = _CPU_GET_INSTRUCTION(state);

    if (cycle == 0)
    {
        _CPU_SET_INSTRUCTION(state, state.data);
        state.rw_mode = CPU_RW_MODE_NONE;

        switch (state.data)
        {
            case IC_INX: _CPU_SET_REG_X(state, state.X + 1); return state;
            case IC_INY: _CPU_SET_REG_Y(state, state.Y + 1); return state;
            case IC_DEX: _CPU_SET_REG_X(state, state.X - 1); return state;
            case IC_DEY: _CPU_SET_REG_Y(state, state.Y - 1); return state;
            case IC_ROL_ACC: _CPU_ROL(state, state.A); return state;
            case IC_ROR_ACC: _CPU_ROR(state, state.A); return state;
            case IC_ASL_ACC: _CPU_ASL(state, state.A); return state;
            case IC_LSR_ACC: _CPU_LSR(state, state.A); return state;
            case IC_TAX: _CPU_SET_REG_X(state, state.A); return state;
            case IC_TAY: _CPU_SET_REG_Y(state, state.A); return state;
            case IC_TSX: _CPU_SET_REG_X(state, state.S); return state;
            case IC_TXA: _CPU_SET_REG_A(state, state.X); return state;
            case IC_TXS: _CPU_SET_REG_S(state, state.X); return state;
            case IC_TYA: _CPU_SET_REG_A(state, state.Y); return state;
            case IC_CLC: _CPU_SET_REG_P(state, state.P & 0xFE); return state;
            case IC_SEC: _CPU_SET_REG_P(state, state.P | 1); return state;
            case IC_CLI: _CPU_SET_REG_P(state, state.P & 0xFB); return state;
            case IC_SEI: _CPU_SET_REG_P(state, state.P | 0x04); return state;
            case IC_CLV: _CPU_SET_REG_P(state, state.P & 0xBF); return state;
            case IC_CLD: _CPU_SET_REG_P(state, state.P & 0xF7); return state;
            case IC_SED: _CPU_SET_REG_P(state, state.P | 0x08); return state;
            case IC_NOP: 
            case IC_IL_NOP_IMM0: case IC_IL_NOP_IMM1: case IC_IL_NOP_IMM2: case IC_IL_NOP_IMM3: case IC_IL_NOP_IMM4: case IC_IL_NOP_IMM5:
                return state;

            case IC_PHP:
                state.rw_mode = CPU_RW_MODE_WRITE;
                state.address = ((uint8_t)state.S--) + 0x0100;
                state.data = state.P | CPU_STATUS_FLAG_BREAK;
                return state;
            case IC_PHA:
                state.rw_mode = CPU_RW_MODE_WRITE;
                state.address = ((uint8_t)state.S--) + 0x0100;
                state.data = state.A;
                return state;
            case IC_PLP: case IC_PLA:
                state.rw_mode = CPU_RW_MODE_READ; // Dummy read
                state.address = state.PC;
                return state;

            case IC_BRK:
                if (state.temp) // Don't increment PC on hardware interrupt
                {
                    state.rw_mode = CPU_RW_MODE_READ;
                    state.address = state.PC;
                    return state;
                }

            case IC_RTS: case IC_RTI:
            case IC_BCC: case IC_BCS: case IC_BNE: case IC_BEQ: case IC_BVC: case IC_BVS: case IC_BPL: case IC_BMI:
            case IC_JMP: case IC_JMP_IND:
            case IC_BIT_ABS: case IC_BIT_ZP: 
            case IC_LDA_IMM: case IC_LDA_ABS: case IC_LDA_ABS_X: case IC_LDA_ABS_Y: case IC_LDA_ZP: case IC_LDA_ZP_X: case IC_LDA_IND_X: case IC_LDA_IND_Y:
            case IC_LDX_IMM: case IC_LDX_ABS: case IC_LDX_ABS_Y: case IC_LDX_ZP: case IC_LDX_ZP_Y: 
            case IC_LDY_IMM: case IC_LDY_ABS: case IC_LDY_ABS_X: case IC_LDY_ZP: case IC_LDY_ZP_X:
            case IC_STA_ABS: case IC_STA_ABS_X: case IC_STA_ABS_Y: case IC_STA_ZP: case IC_STA_ZP_X: case IC_STA_IND_X: case IC_STA_IND_Y:
            case IC_STX_ABS: case IC_STX_ZP: case IC_STX_ZP_Y: case IC_STY_ABS: case IC_STY_ZP: case IC_STY_ZP_X:
            case IC_ROL_ABS: case IC_ROL_ABS_X: case IC_ROL_ZP: case IC_ROL_ZP_X: 
            case IC_ROR_ABS: case IC_ROR_ABS_X: case IC_ROR_ZP: case IC_ROR_ZP_X: 
            case IC_DEC_ABS: case IC_DEC_ABS_X: case IC_DEC_ZP: case IC_DEC_ZP_X:
            case IC_INC_ABS: case IC_INC_ABS_X: case IC_INC_ZP: case IC_INC_ZP_X:
            case IC_ASL_ABS: case IC_ASL_ABS_X: case IC_ASL_ZP: case IC_ASL_ZP_X: 
            case IC_LSR_ABS: case IC_LSR_ABS_X: case IC_LSR_ZP: case IC_LSR_ZP_X: 
            case IC_AND_IMM: case IC_AND_ABS: case IC_AND_ABS_X: case IC_AND_ABS_Y: case IC_AND_ZP: case IC_AND_ZP_X: case IC_AND_IND_X: case IC_AND_IND_Y:
            case IC_ORA_IMM: case IC_ORA_ABS: case IC_ORA_ABS_X: case IC_ORA_ABS_Y: case IC_ORA_ZP: case IC_ORA_ZP_X: case IC_ORA_IND_X: case IC_ORA_IND_Y:
            case IC_EOR_IMM: case IC_EOR_ABS: case IC_EOR_ABS_X: case IC_EOR_ABS_Y: case IC_EOR_ZP: case IC_EOR_ZP_X: case IC_EOR_IND_X: case IC_EOR_IND_Y:
            case IC_ADC_IMM: case IC_ADC_ABS: case IC_ADC_ABS_X: case IC_ADC_ABS_Y: case IC_ADC_ZP: case IC_ADC_ZP_X: case IC_ADC_IND_X: case IC_ADC_IND_Y:
            case IC_SBC_IMM: case IC_SBC_ABS: case IC_SBC_ABS_X: case IC_SBC_ABS_Y: case IC_SBC_ZP: case IC_SBC_ZP_X: case IC_SBC_IND_X: case IC_SBC_IND_Y:
            case IC_CMP_IMM: case IC_CMP_ABS: case IC_CMP_ABS_X: case IC_CMP_ABS_Y: case IC_CMP_ZP: case IC_CMP_ZP_X: case IC_CMP_IND_X: case IC_CMP_IND_Y:
            case IC_CPX_IMM: case IC_CPX_ABS: case IC_CPX_ZP:
            case IC_CPY_IMM: case IC_CPY_ABS: case IC_CPY_ZP:
            case IC_JSR:
            case IC_IL_ANC_IMM: case IC_IL_AAC_IMM: case IC_IL_ALR_IMM: case IC_IL_ARR_IMM: case IC_IL_AXS_IMM:
            case IC_IL_LAX_IMM: case IC_IL_LAX_ABS: case IC_IL_LAX_ABS_Y: case IC_IL_LAX_ZP: case IC_IL_LAX_ZP_Y: case IC_IL_LAX_IND_X: case IC_IL_LAX_IND_Y:
            case IC_IL_SAX_ABS: case IC_IL_SAX_ZP: case IC_IL_SAX_ZP_Y: case IC_IL_SAX_IND_X:
            case IC_IL_XAA_IMM:
            case IC_IL_LAS_ABS_Y:
            case IC_IL_SHY_ABS_X: case IC_IL_SHX_ABS_Y: case IC_IL_SHA_ABS_Y: case IC_IL_SHA_IND_Y: case IC_IL_TAS_ABS_Y:
            case IC_IL_SBC_IMM:
            case IC_IL_NOP_ZP0: case IC_IL_NOP_ZP1: case IC_IL_NOP_ZP2:
            case IC_IL_NOP_ABS:
            case IC_IL_NOP_ABS_X0: case IC_IL_NOP_ABS_X1: case IC_IL_NOP_ABS_X2: case IC_IL_NOP_ABS_X3: case IC_IL_NOP_ABS_X4: case IC_IL_NOP_ABS_X5:
            case IC_IL_NOP_ZP_X0: case IC_IL_NOP_ZP_X1: case IC_IL_NOP_ZP_X2: case IC_IL_NOP_ZP_X3: case IC_IL_NOP_ZP_X4: case IC_IL_NOP_ZP_X5:
            case IC_IL_NOP_IMP0: case IC_IL_NOP_IMP1: case IC_IL_NOP_IMP2: case IC_IL_NOP_IMP3: case IC_IL_NOP_IMP4:
            case IC_IL_DCP_ABS: case IC_IL_DCP_ABS_X: case IC_IL_DCP_ABS_Y: case IC_IL_DCP_ZP: case IC_IL_DCP_ZP_X: case IC_IL_DCP_IND_X: case IC_IL_DCP_IND_Y:
            case IC_IL_ISB_ABS: case IC_IL_ISB_ABS_X: case IC_IL_ISB_ABS_Y: case IC_IL_ISB_ZP: case IC_IL_ISB_ZP_X: case IC_IL_ISB_IND_X: case IC_IL_ISB_IND_Y:
            case IC_IL_SLO_ABS: case IC_IL_SLO_ABS_X: case IC_IL_SLO_ABS_Y: case IC_IL_SLO_ZP: case IC_IL_SLO_ZP_X: case IC_IL_SLO_IND_X: case IC_IL_SLO_IND_Y:
            case IC_IL_RLA_ABS: case IC_IL_RLA_ABS_X: case IC_IL_RLA_ABS_Y: case IC_IL_RLA_ZP: case IC_IL_RLA_ZP_X: case IC_IL_RLA_IND_X: case IC_IL_RLA_IND_Y:
            case IC_IL_SRE_ABS: case IC_IL_SRE_ABS_X: case IC_IL_SRE_ABS_Y: case IC_IL_SRE_ZP: case IC_IL_SRE_ZP_X: case IC_IL_SRE_IND_X: case IC_IL_SRE_IND_Y:
            case IC_IL_RRA_ABS: case IC_IL_RRA_ABS_X: case IC_IL_RRA_ABS_Y: case IC_IL_RRA_ZP: case IC_IL_RRA_ZP_X: case IC_IL_RRA_IND_X: case IC_IL_RRA_IND_Y:

                /* fetch first operand */
                state.rw_mode = CPU_RW_MODE_READ;
                state.address = state.PC++;
                return state;

            default: 
                // Unknown instruction, treated as NOP
                return state;
        }
    }
    else if (cycle == 1)
    {
        state.rw_mode = CPU_RW_MODE_NONE;
        switch (instruction)
        {
            case IC_BRK:
                state.rw_mode = CPU_RW_MODE_WRITE;
                state.data = state.PC >> 8;
                state.address = ((uint8_t)state.S--) + 0x0100;
                return state;
            case IC_ADC_IMM: _CPU_ADC(state); break;
            case IC_AND_IMM: _CPU_SET_REG_A(state, state.A & state.data); break;
            case IC_ORA_IMM: _CPU_SET_REG_A(state, state.A | state.data); break;
            case IC_EOR_IMM: _CPU_SET_REG_A(state, state.A ^ state.data); break;
            case IC_LDA_IMM: _CPU_SET_REG_A(state, state.data); break;
            case IC_LDX_IMM: _CPU_SET_REG_X(state, state.data); break;
            case IC_LDY_IMM: _CPU_SET_REG_Y(state, state.data); break;
            case IC_IL_LAX_IMM: _CPU_LAX(state); break;
            case IC_IL_ANC_IMM: 
            case IC_IL_AAC_IMM: _CPU_ANC(state); break;
            case IC_IL_ALR_IMM: _CPU_ALR(state); break;
            case IC_IL_ARR_IMM: _CPU_ARR(state); break;
            case IC_IL_AXS_IMM: _CPU_AXS(state); break;
            case IC_IL_XAA_IMM: _CPU_XAA(state); break;
            case IC_IL_SBC_IMM:
            case IC_SBC_IMM: _CPU_SBC(state); break;
            case IC_CMP_IMM: _CPU_CMP(state, state.A); break;
            case IC_CPX_IMM: _CPU_CMP(state, state.X); break;
            case IC_CPY_IMM: _CPU_CMP(state, state.Y); break;
            case IC_BCC:     _CPU_COND_BRANCH(state, (state.P & 0x01) == 0); break;
            case IC_BCS:     _CPU_COND_BRANCH(state, (state.P & 0x01)); break;
            case IC_BNE:     _CPU_COND_BRANCH(state, (state.P & 0x02) == 0); break;
            case IC_BEQ:     _CPU_COND_BRANCH(state, (state.P & 0x02)); break;
            case IC_BVC:     _CPU_COND_BRANCH(state, (state.P & 0x40) == 0); break;
            case IC_BVS:     _CPU_COND_BRANCH(state, (state.P & 0x40)); break;
            case IC_BPL:     _CPU_COND_BRANCH(state, (state.P & 0x80) == 0); break;
            case IC_BMI:     _CPU_COND_BRANCH(state, (state.P & 0x80)); break;
            case IC_LDA_ABS: case IC_LDA_ABS_X: case IC_LDA_ABS_Y:
            case IC_LDX_ABS: case IC_LDX_ABS_Y:
            case IC_LDY_ABS: case IC_LDY_ABS_X:
            case IC_STA_ABS: case IC_STA_ABS_X: case IC_STA_ABS_Y:
            case IC_STX_ABS:
            case IC_STY_ABS:
            case IC_IL_LAS_ABS_Y:
            case IC_IL_SHY_ABS_X: case IC_IL_SHX_ABS_Y: case IC_IL_SHA_ABS_Y: case IC_IL_TAS_ABS_Y:
            case IC_ROL_ABS: case IC_ROL_ABS_X:
            case IC_ROR_ABS: case IC_ROR_ABS_X:
            case IC_ASL_ABS: case IC_ASL_ABS_X:
            case IC_LSR_ABS: case IC_LSR_ABS_X:
            case IC_DEC_ABS: case IC_DEC_ABS_X:
            case IC_INC_ABS: case IC_INC_ABS_X:
            case IC_AND_ABS: case IC_AND_ABS_X: case IC_AND_ABS_Y:
            case IC_ORA_ABS: case IC_ORA_ABS_X: case IC_ORA_ABS_Y:
            case IC_EOR_ABS: case IC_EOR_ABS_X: case IC_EOR_ABS_Y:
            case IC_ADC_ABS: case IC_ADC_ABS_X: case IC_ADC_ABS_Y:
            case IC_SBC_ABS: case IC_SBC_ABS_X: case IC_SBC_ABS_Y:
            case IC_CMP_ABS: case IC_CMP_ABS_X: case IC_CMP_ABS_Y:
            case IC_CPX_ABS:
            case IC_CPY_ABS:
            case IC_BIT_ABS:
            case IC_JMP: case IC_JMP_IND:
            case IC_IL_NOP_ABS:
            case IC_IL_NOP_ABS_X0: case IC_IL_NOP_ABS_X1: case IC_IL_NOP_ABS_X2: case IC_IL_NOP_ABS_X3: case IC_IL_NOP_ABS_X4: case IC_IL_NOP_ABS_X5:
            case IC_IL_LAX_ABS: case IC_IL_LAX_ABS_Y:
            case IC_IL_SAX_ABS:
            case IC_IL_DCP_ABS: case IC_IL_DCP_ABS_X: case IC_IL_DCP_ABS_Y:
            case IC_IL_ISB_ABS: case IC_IL_ISB_ABS_X: case IC_IL_ISB_ABS_Y:
            case IC_IL_SLO_ABS: case IC_IL_SLO_ABS_X: case IC_IL_SLO_ABS_Y:
            case IC_IL_RLA_ABS: case IC_IL_RLA_ABS_X: case IC_IL_RLA_ABS_Y:
            case IC_IL_SRE_ABS: case IC_IL_SRE_ABS_X: case IC_IL_SRE_ABS_Y:
            case IC_IL_RRA_ABS: case IC_IL_RRA_ABS_X: case IC_IL_RRA_ABS_Y:

                /* fetch high byte of absolute address */
                state.rw_mode = CPU_RW_MODE_READ;
                state.address = state.PC++;
                state.temp = state.data;
                return state;

            case IC_LDA_ZP:
            case IC_LDX_ZP:
            case IC_LDY_ZP:
            case IC_BIT_ZP:
            case IC_ROL_ZP:
            case IC_ROR_ZP:
            case IC_ASL_ZP:
            case IC_LSR_ZP:
            case IC_ADC_ZP:
            case IC_SBC_ZP:
            case IC_CMP_ZP:
            case IC_CPX_ZP:
            case IC_CPY_ZP:
            case IC_DEC_ZP:
            case IC_INC_ZP:
            case IC_AND_ZP:
            case IC_ORA_ZP:
            case IC_EOR_ZP:
            case IC_IL_NOP_ZP0: case IC_IL_NOP_ZP1: case IC_IL_NOP_ZP2:
            case IC_IL_LAX_ZP:
            case IC_IL_DCP_ZP:
            case IC_IL_ISB_ZP:
            case IC_IL_SLO_ZP:
            case IC_IL_RLA_ZP:
            case IC_IL_SRE_ZP:
            case IC_IL_RRA_ZP:
                state.rw_mode = CPU_RW_MODE_READ;
                state.address = state.data;
                return state;
            case IC_LDA_ZP_X:
            case IC_LDY_ZP_X:
            case IC_ROL_ZP_X:
            case IC_ROR_ZP_X:
            case IC_ASL_ZP_X:
            case IC_LSR_ZP_X:
            case IC_ADC_ZP_X:
            case IC_SBC_ZP_X:
            case IC_CMP_ZP_X:
            case IC_DEC_ZP_X:
            case IC_INC_ZP_X:
            case IC_AND_ZP_X:
            case IC_ORA_ZP_X:
            case IC_EOR_ZP_X:
            case IC_IL_NOP_ZP_X0: case IC_IL_NOP_ZP_X1: case IC_IL_NOP_ZP_X2: case IC_IL_NOP_ZP_X3: case IC_IL_NOP_ZP_X4: case IC_IL_NOP_ZP_X5:
            case IC_IL_DCP_ZP_X:
            case IC_IL_ISB_ZP_X:
            case IC_IL_SLO_ZP_X:
            case IC_IL_RLA_ZP_X:
            case IC_IL_SRE_ZP_X:
            case IC_IL_RRA_ZP_X:
                state.rw_mode = CPU_RW_MODE_READ;
                state.address = (state.data + state.X) & 0xFF;
                return state; 
            case IC_LDX_ZP_Y:
            case IC_IL_LAX_ZP_Y:
                state.rw_mode = CPU_RW_MODE_READ;
                state.address = (state.data + state.Y) & 0xFF;
                return state;
            case IC_STA_ZP:
                state.rw_mode = CPU_RW_MODE_WRITE;
                state.address = state.data;
                state.data = state.A;
                return state;
            case IC_STA_ZP_X:
                state.rw_mode = CPU_RW_MODE_WRITE;
                state.address = (state.data + state.X) & 0xFF;
                state.data = state.A;
                return state;
            case IC_STX_ZP:
                state.rw_mode = CPU_RW_MODE_WRITE;
                state.address = state.data;
                state.data = state.X;
                return state;
            case IC_STX_ZP_Y:
                state.rw_mode = CPU_RW_MODE_WRITE;
                state.address = (state.data + state.Y) & 0xFF;
                state.data = state.X;
                return state;
            case IC_STY_ZP:
                state.rw_mode = CPU_RW_MODE_WRITE;
                state.address = state.data;
                state.data = state.Y;
                return state;
            case IC_STY_ZP_X:
                state.rw_mode = CPU_RW_MODE_WRITE;
                state.address = (state.data + state.X) & 0xFF;
                state.data = state.Y;
                return state;
            case IC_IL_SAX_ZP:
                state.rw_mode = CPU_RW_MODE_WRITE;
                state.address = state.data;
                state.data = state.A & state.X;
                return state;
            case IC_IL_SAX_ZP_Y:
                state.rw_mode = CPU_RW_MODE_WRITE;
                state.address = (state.data + state.Y) & 0xFF;
                state.data = state.A & state.X;
                return state;
            case IC_LDA_IND_X:
            case IC_STA_IND_X:
            case IC_ADC_IND_X:
            case IC_SBC_IND_X:
            case IC_CMP_IND_X:
            case IC_AND_IND_X:
            case IC_ORA_IND_X:
            case IC_EOR_IND_X:
            case IC_IL_LAX_IND_X:
            case IC_IL_SAX_IND_X:
            case IC_IL_DCP_IND_X:
            case IC_IL_ISB_IND_X:
            case IC_IL_SLO_IND_X:
            case IC_IL_RLA_IND_X:
            case IC_IL_SRE_IND_X:
            case IC_IL_RRA_IND_X:
                state.rw_mode = CPU_RW_MODE_READ;
                state.address = (state.data + state.X) & 0xFF;
                return state;
            case IC_LDA_IND_Y:
            case IC_STA_IND_Y:
            case IC_ADC_IND_Y:
            case IC_SBC_IND_Y:
            case IC_CMP_IND_Y:
            case IC_AND_IND_Y:
            case IC_ORA_IND_Y:
            case IC_EOR_IND_Y:
            case IC_IL_LAX_IND_Y:
            case IC_IL_DCP_IND_Y:
            case IC_IL_ISB_IND_Y:
            case IC_IL_SLO_IND_Y:
            case IC_IL_RLA_IND_Y:
            case IC_IL_SRE_IND_Y:
            case IC_IL_RRA_IND_Y:
            case IC_IL_SHA_IND_Y:
                state.rw_mode = CPU_RW_MODE_READ;
                state.address = state.data;
                return state;
            case IC_JSR:
                state.rw_mode = CPU_RW_MODE_NONE;
                state.temp = state.data;
                return state;
            case IC_RTS: case IC_RTI: case IC_PLA: case IC_PLP:
                state.rw_mode = CPU_RW_MODE_READ;
                state.address = ((uint8_t)++state.S) + 0x0100;
                return state;
            case IC_PHA:
            case IC_PHP:
                state.rw_mode = CPU_RW_MODE_NONE;
                // empty cycle
                return state;
            default:
                break;
        }
    }
    else if (cycle == 2)
    {
        switch (instruction)
        {
            case IC_BRK:
                state.data = (uint8_t)state.PC;
                state.address = ((uint8_t)state.S--) + 0x0100;
                return state;

            case IC_BCC: case IC_BCS: case IC_BNE: case IC_BEQ: case IC_BVC: case IC_BVS: case IC_BPL: case IC_BMI:
                _CPU_COND_BRANCH_TAKEN(state);
                break;

            case IC_LDA_ABS:
            case IC_LDX_ABS:
            case IC_LDY_ABS:
            case IC_ROL_ABS:
            case IC_ROR_ABS:
            case IC_DEC_ABS:
            case IC_INC_ABS:
            case IC_ASL_ABS:
            case IC_LSR_ABS:
            case IC_ADC_ABS:
            case IC_SBC_ABS:
            case IC_CMP_ABS:
            case IC_CPX_ABS:
            case IC_CPY_ABS:
            case IC_AND_ABS:
            case IC_ORA_ABS:
            case IC_EOR_ABS:
            case IC_BIT_ABS:
            case IC_IL_NOP_ABS:
            case IC_IL_LAX_ABS:
            case IC_IL_DCP_ABS:
            case IC_IL_ISB_ABS:
            case IC_IL_SLO_ABS:
            case IC_IL_RLA_ABS:
            case IC_IL_SRE_ABS:
            case IC_IL_RRA_ABS:
                state.rw_mode = CPU_RW_MODE_READ;
                state.address = (state.data << 8) | state.temp;
                return state;
            case IC_LDA_ABS_X:
            case IC_LDY_ABS_X:
            case IC_STA_ABS_X:
            case IC_ROL_ABS_X:
            case IC_ROR_ABS_X:
            case IC_DEC_ABS_X:
            case IC_INC_ABS_X:
            case IC_ASL_ABS_X:
            case IC_LSR_ABS_X:
            case IC_ADC_ABS_X:
            case IC_SBC_ABS_X:
            case IC_CMP_ABS_X:
            case IC_AND_ABS_X:
            case IC_ORA_ABS_X:
            case IC_EOR_ABS_X:
            case IC_IL_NOP_ABS_X0: case IC_IL_NOP_ABS_X1: case IC_IL_NOP_ABS_X2: case IC_IL_NOP_ABS_X3: case IC_IL_NOP_ABS_X4: case IC_IL_NOP_ABS_X5:
            case IC_IL_DCP_ABS_X:
            case IC_IL_ISB_ABS_X:
            case IC_IL_SLO_ABS_X:
            case IC_IL_RLA_ABS_X:
            case IC_IL_SRE_ABS_X:
            case IC_IL_RRA_ABS_X:
            case IC_IL_SHY_ABS_X:
                state.rw_mode = CPU_RW_MODE_READ;
                state.address = (state.data << 8) | ((state.temp + state.X) & 0xFF);
                state.temp = ((uint16_t)state.temp + (uint16_t)state.X) >> 8;
                return state;
            case IC_LDA_ABS_Y:
            case IC_LDX_ABS_Y:
            case IC_STA_ABS_Y:
            case IC_ADC_ABS_Y:
            case IC_SBC_ABS_Y:
            case IC_CMP_ABS_Y:
            case IC_AND_ABS_Y:
            case IC_ORA_ABS_Y:
            case IC_EOR_ABS_Y:
            case IC_IL_LAX_ABS_Y:
            case IC_IL_DCP_ABS_Y:
            case IC_IL_ISB_ABS_Y:
            case IC_IL_SLO_ABS_Y:
            case IC_IL_RLA_ABS_Y:
            case IC_IL_SRE_ABS_Y:
            case IC_IL_RRA_ABS_Y:
            case IC_IL_LAS_ABS_Y:
            case IC_IL_SHX_ABS_Y:
            case IC_IL_SHA_ABS_Y:
            case IC_IL_TAS_ABS_Y:
                state.rw_mode = CPU_RW_MODE_READ;
                state.address = (state.data << 8) | ((state.temp + state.Y) & 0xFF);
                state.temp = ((uint16_t)state.temp + (uint16_t)state.Y) >> 8;
                return state;
            case IC_STA_ABS:
                state.rw_mode = CPU_RW_MODE_WRITE;
                state.address = (state.data << 8) | state.temp;
                state.data = state.A;
                return state;
            case IC_STX_ABS:
                state.rw_mode = CPU_RW_MODE_WRITE;
                state.address = (state.data << 8) | state.temp;
                state.data = state.X;
                return state;
            case IC_STY_ABS:
                state.rw_mode = CPU_RW_MODE_WRITE;
                state.address = (state.data << 8) | state.temp;
                state.data = state.Y;
                return state;
            case IC_IL_SAX_ABS:
                state.rw_mode = CPU_RW_MODE_WRITE;
                state.address = (state.data << 8) | state.temp;
                state.data = state.A & state.X;
                return state;
            case IC_LDA_IND_X:
            case IC_LDA_IND_Y:
            case IC_STA_IND_X:
            case IC_STA_IND_Y:
            case IC_ADC_IND_X:
            case IC_ADC_IND_Y:
            case IC_SBC_IND_X:
            case IC_SBC_IND_Y:
            case IC_CMP_IND_X:
            case IC_CMP_IND_Y:
            case IC_AND_IND_X:
            case IC_AND_IND_Y:
            case IC_ORA_IND_X:
            case IC_ORA_IND_Y:
            case IC_EOR_IND_X:
            case IC_EOR_IND_Y:
            case IC_IL_LAX_IND_X:
            case IC_IL_LAX_IND_Y:
            case IC_IL_SAX_IND_X:
            case IC_IL_DCP_IND_X:
            case IC_IL_DCP_IND_Y:
            case IC_IL_ISB_IND_X:
            case IC_IL_ISB_IND_Y:
            case IC_IL_SLO_IND_X:
            case IC_IL_SLO_IND_Y:
            case IC_IL_RLA_IND_X:
            case IC_IL_RLA_IND_Y:
            case IC_IL_SRE_IND_X:
            case IC_IL_SRE_IND_Y:
            case IC_IL_RRA_IND_X:
            case IC_IL_RRA_IND_Y:
            case IC_IL_SHA_IND_Y:
                state.rw_mode = CPU_RW_MODE_READ;
                state.address = (state.address + 1) & 0xFF;
                state.temp = state.data;
                return state;
            case IC_JMP:
                state.rw_mode = CPU_RW_MODE_NONE;
                state.PC = (state.data << 8) | state.temp;
                break;
            case IC_JMP_IND:
                state.rw_mode = CPU_RW_MODE_READ;
                state.address = (state.data << 8) | state.temp;
                return state;
            case IC_BIT_ZP: _CPU_BIT(state); break;
            case IC_LDA_ZP: _CPU_SET_REG_A(state, state.data); break;
            case IC_LDX_ZP: _CPU_SET_REG_X(state, state.data); break;
            case IC_LDY_ZP: _CPU_SET_REG_Y(state, state.data); break;
            case IC_ADC_ZP: _CPU_ADC(state); break;
            case IC_SBC_ZP: _CPU_SBC(state); break;
            case IC_CMP_ZP: _CPU_CMP(state, state.A); break;
            case IC_CPX_ZP: _CPU_CMP(state, state.X); break;
            case IC_CPY_ZP: _CPU_CMP(state, state.Y); break;
            case IC_AND_ZP: _CPU_SET_REG_A(state, state.A & state.data); break;
            case IC_ORA_ZP: _CPU_SET_REG_A(state, state.A | state.data); break;
            case IC_EOR_ZP: _CPU_SET_REG_A(state, state.A ^ state.data); break;
            case IC_IL_LAX_ZP: _CPU_LAX(state); break;
            case IC_LDA_ZP_X:
                _CPU_SET_REG_A(state, state.data);
                return state; 
            case IC_LDY_ZP_X:
                _CPU_SET_REG_Y(state, state.data);
                return state;
            case IC_LDX_ZP_Y:
                _CPU_SET_REG_X(state, state.data);
                return state;
            case IC_IL_LAX_ZP_Y:
                _CPU_LAX(state);
                return state;
            case IC_JSR:
                state.rw_mode = CPU_RW_MODE_WRITE;
                state.data = (state.PC >> 8);
                state.address = ((uint8_t)state.S--) + 0x0100;
                return state;
            case IC_RTI:
                state.rw_mode = CPU_RW_MODE_READ;
                _CPU_SET_REG_P(state, state.data & ~CPU_STATUS_FLAG_BREAK);
                state.address = ((uint8_t)++state.S) + 0x0100;
                return state;
            case IC_RTS:
                state.rw_mode = CPU_RW_MODE_NONE;
                return state;
            case IC_PLA:
                state.rw_mode = CPU_RW_MODE_NONE;
                _CPU_SET_REG_A(state, state.data);
                return state;
            case IC_PLP:
                state.rw_mode = CPU_RW_MODE_NONE;
                _CPU_SET_REG_P(state, state.data & ~CPU_STATUS_FLAG_BREAK);
                return state;

            case IC_ROL_ZP:
            case IC_ROL_ZP_X:
            case IC_ROR_ZP:
            case IC_ROR_ZP_X:
            case IC_DEC_ZP:
            case IC_DEC_ZP_X:
            case IC_INC_ZP:
            case IC_INC_ZP_X:
            case IC_ASL_ZP:
            case IC_ASL_ZP_X:
            case IC_LSR_ZP:
            case IC_LSR_ZP_X:
            case IC_IL_SAX_ZP_Y:
            case IC_IL_DCP_ZP:
            case IC_IL_DCP_ZP_X:
            case IC_IL_ISB_ZP:
            case IC_IL_ISB_ZP_X:
            case IC_IL_SLO_ZP:
            case IC_IL_SLO_ZP_X:
            case IC_IL_RLA_ZP:
            case IC_IL_RLA_ZP_X:
            case IC_IL_SRE_ZP:
            case IC_IL_SRE_ZP_X:
            case IC_IL_RRA_ZP:
            case IC_IL_RRA_ZP_X:
                state.rw_mode = CPU_RW_MODE_WRITE;
                return state;

            case IC_STA_ZP_X:
            case IC_STX_ZP_Y:
            case IC_STY_ZP_X:
            case IC_ADC_ZP_X:
            case IC_SBC_ZP_X:
            case IC_CMP_ZP_X:
            case IC_AND_ZP_X:
            case IC_ORA_ZP_X:
            case IC_EOR_ZP_X:
            case IC_IL_NOP_ZP_X0: case IC_IL_NOP_ZP_X1: case IC_IL_NOP_ZP_X2: case IC_IL_NOP_ZP_X3: case IC_IL_NOP_ZP_X4: case IC_IL_NOP_ZP_X5:
                state.rw_mode = CPU_RW_MODE_NONE;
                // empty cycles
                return state;
            default: break;
        }
    }
    else if (cycle == 3)
    {
        switch(instruction)
        {
            case IC_BRK:
                state.data = state.P;
                if (state.temp == 0 || state.temp == 0xFC)
                    state.data |= CPU_STATUS_FLAG_BREAK;

                if (state.nmi_phase0)
                {
                    state.nmi = 0;
                    state.nmi_phase0 = 0;
                    state.temp = 0xFA;
                }
                else if (state.irq_phase0 || state.temp == 0)
                {
                    state.temp = 0xFE;
                }

                state.address = ((uint8_t)state.S--) + 0x0100;
                return state;

            case IC_LDA_ABS: _CPU_SET_REG_A(state, state.data); break;
            case IC_LDX_ABS: _CPU_SET_REG_X(state, state.data); break;
            case IC_LDY_ABS: _CPU_SET_REG_Y(state, state.data); break;
            case IC_IL_LAX_ABS: _CPU_LAX(state); break;
            case IC_ADC_ABS: case IC_ADC_ZP_X: _CPU_ADC(state); break;
            case IC_SBC_ABS: case IC_SBC_ZP_X: _CPU_SBC(state); break;
            case IC_CMP_ABS: case IC_CMP_ZP_X: _CPU_CMP(state, state.A); break;
            case IC_CPX_ABS: _CPU_CMP(state, state.X); break;
            case IC_CPY_ABS: _CPU_CMP(state, state.Y); break;
            case IC_AND_ABS: case IC_AND_ZP_X: _CPU_SET_REG_A(state, state.A & state.data); break;
            case IC_ORA_ABS: case IC_ORA_ZP_X: _CPU_SET_REG_A(state, state.A | state.data); break;
            case IC_EOR_ABS: case IC_EOR_ZP_X: _CPU_SET_REG_A(state, state.A ^ state.data); break;

            case IC_IL_NOP_ABS_X0: case IC_IL_NOP_ABS_X1: case IC_IL_NOP_ABS_X2: case IC_IL_NOP_ABS_X3: case IC_IL_NOP_ABS_X4: case IC_IL_NOP_ABS_X5:
                _CPU_CHECK_PAGE_CROSS(state);
                break;

            case IC_LDA_ABS_X: case IC_LDA_ABS_Y:
                _CPU_CHECK_PAGE_CROSS(state);
                _CPU_SET_REG_A(state, state.data);
                break;

            case IC_LDX_ABS_Y:
                _CPU_CHECK_PAGE_CROSS(state);
                _CPU_SET_REG_X(state, state.data);
                break;

            case IC_LDY_ABS_X:
                _CPU_CHECK_PAGE_CROSS(state);
                _CPU_SET_REG_Y(state, state.data);
                break;

            case IC_IL_LAX_ABS_Y:
                _CPU_CHECK_PAGE_CROSS(state);
                _CPU_LAX(state);
                break;

            case IC_ADC_ABS_X: case IC_ADC_ABS_Y:
                _CPU_CHECK_PAGE_CROSS(state);
                _CPU_ADC(state); 
                break;

            case IC_SBC_ABS_X: case IC_SBC_ABS_Y:
                _CPU_CHECK_PAGE_CROSS(state);
                _CPU_SBC(state); 
                break;

            case IC_CMP_ABS_X: case IC_CMP_ABS_Y:
                _CPU_CHECK_PAGE_CROSS(state);
                _CPU_CMP(state, state.A);
                break;

            case IC_AND_ABS_X: case IC_AND_ABS_Y:
                _CPU_CHECK_PAGE_CROSS(state);
                _CPU_SET_REG_A(state, state.A & state.data); 
                break;

            case IC_ORA_ABS_X: case IC_ORA_ABS_Y:
                _CPU_CHECK_PAGE_CROSS(state);
                _CPU_SET_REG_A(state, state.A | state.data); 
                break;

            case IC_EOR_ABS_X: case IC_EOR_ABS_Y:
                _CPU_CHECK_PAGE_CROSS(state);
                _CPU_SET_REG_A(state, state.A ^ state.data); 
                break;

            case IC_IL_LAS_ABS_Y:
                _CPU_CHECK_PAGE_CROSS(state);
                _CPU_LAS(state);
                break;

            case IC_STA_ABS_X:
                state.rw_mode = CPU_RW_MODE_WRITE;
                state.address += state.temp * 0x0100;
                state.data = state.A;
                return state;

            case IC_STA_ABS_Y:
                state.rw_mode = CPU_RW_MODE_WRITE;
                state.address += state.temp * 0x0100;
                state.data = state.A;
                return state;

            case IC_ROL_ABS_X:
            case IC_ROR_ABS_X:
            case IC_DEC_ABS_X:
            case IC_INC_ABS_X:
            case IC_ASL_ABS_X:
            case IC_LSR_ABS_X:
            case IC_IL_DCP_ABS_X: case IC_IL_DCP_ABS_Y: 
            case IC_IL_ISB_ABS_X: case IC_IL_ISB_ABS_Y: 
            case IC_IL_SLO_ABS_X: case IC_IL_SLO_ABS_Y: 
            case IC_IL_RLA_ABS_X: case IC_IL_RLA_ABS_Y: 
            case IC_IL_SRE_ABS_X: case IC_IL_SRE_ABS_Y: 
            case IC_IL_RRA_ABS_X: case IC_IL_RRA_ABS_Y: 
                state.rw_mode = CPU_RW_MODE_READ;
                state.address += state.temp * 0x0100;
                return state;
            case IC_IL_SHY_ABS_X:
                _CPU_SHAXY(state, state.Y, was_halted);
                return state;
            case IC_IL_SHX_ABS_Y:
                _CPU_SHAXY(state, state.X, was_halted);
                return state;
            case IC_IL_SHA_ABS_Y:
                _CPU_SHAXY(state, (state.A & state.X), was_halted);
                return state;
            case IC_IL_TAS_ABS_Y:
                state.S = state.A & state.X;
                _CPU_SHAXY(state, state.S, was_halted);
                return state;
            case IC_ROL_ABS: 
            case IC_ROR_ABS: 
            case IC_DEC_ABS: 
            case IC_INC_ABS: 
            case IC_ASL_ABS:
            case IC_LSR_ABS: 
            case IC_IL_DCP_ABS: 
            case IC_IL_ISB_ABS: 
            case IC_IL_SLO_ABS: 
            case IC_IL_RLA_ABS: 
            case IC_IL_SRE_ABS: 
            case IC_IL_RRA_ABS: 
                state.rw_mode = CPU_RW_MODE_WRITE;
                return state;

            case IC_ROL_ZP: case IC_ROL_ZP_X:
                state.rw_mode = CPU_RW_MODE_WRITE;
                _CPU_ROL(state, state.data);
                return state;

            case IC_ROR_ZP: case IC_ROR_ZP_X:
                state.rw_mode = CPU_RW_MODE_WRITE;
                _CPU_ROR(state, state.data);
                return state;

            case IC_DEC_ZP: case IC_DEC_ZP_X:
                state.rw_mode = CPU_RW_MODE_WRITE;
                _CPU_DEC(state);
                return state;

            case IC_INC_ZP: case IC_INC_ZP_X:
                state.rw_mode = CPU_RW_MODE_WRITE;
                _CPU_INC(state);
                return state;

            case IC_ASL_ZP: case IC_ASL_ZP_X:
                state.rw_mode = CPU_RW_MODE_WRITE;
                _CPU_ASL(state, state.data);
                return state;

            case IC_LSR_ZP: case IC_LSR_ZP_X:
                state.rw_mode = CPU_RW_MODE_WRITE;
                _CPU_LSR(state, state.data);
                return state;

            case IC_IL_DCP_ZP: case IC_IL_DCP_ZP_X:
                _CPU_DCP(state);
                return state;

            case IC_IL_ISB_ZP: case IC_IL_ISB_ZP_X:
                _CPU_ISB(state);
                return state;

            case IC_IL_SLO_ZP: case IC_IL_SLO_ZP_X:
                _CPU_SLO(state);
                return state;

            case IC_IL_RLA_ZP: case IC_IL_RLA_ZP_X:
                _CPU_RLA(state);
                return state;

            case IC_IL_SRE_ZP: case IC_IL_SRE_ZP_X:
                _CPU_SRE(state);
                return state;

            case IC_IL_RRA_ZP: case IC_IL_RRA_ZP_X:
                _CPU_RRA(state);
                return state;

            case IC_BIT_ABS:    _CPU_BIT(state); break;

            case IC_LDA_IND_X:
            case IC_ADC_IND_X:
            case IC_SBC_IND_X:
            case IC_CMP_IND_X:
            case IC_AND_IND_X:
            case IC_ORA_IND_X:
            case IC_EOR_IND_X:
            case IC_IL_LAX_IND_X:
            case IC_IL_DCP_IND_X:
            case IC_IL_ISB_IND_X:
            case IC_IL_SLO_IND_X:
            case IC_IL_RLA_IND_X:
            case IC_IL_SRE_IND_X:
            case IC_IL_RRA_IND_X:
                state.rw_mode = CPU_RW_MODE_READ;
                state.address = (state.data << 8) | state.temp;
                return state;
            case IC_LDA_IND_Y:
            case IC_ADC_IND_Y:
            case IC_SBC_IND_Y:
            case IC_CMP_IND_Y:
            case IC_AND_IND_Y:
            case IC_ORA_IND_Y:
            case IC_EOR_IND_Y:
            case IC_IL_LAX_IND_Y:
            case IC_IL_DCP_IND_Y:
            case IC_IL_ISB_IND_Y:
            case IC_IL_SLO_IND_Y:
            case IC_IL_RLA_IND_Y:
            case IC_IL_SRE_IND_Y:
            case IC_IL_RRA_IND_Y:
            case IC_IL_SHA_IND_Y:
                state.rw_mode = CPU_RW_MODE_READ;
                state.address = (state.data << 8) | ((state.temp + state.Y) & 0xFF);
                state.temp = ((uint16_t)state.temp + (uint16_t)state.Y) >> 8;
                return state;
            case IC_STA_IND_X:
                state.rw_mode = CPU_RW_MODE_WRITE;
                state.address = (state.data << 8) | state.temp;
                state.data = state.A;
                return state;
            case IC_STA_IND_Y:
                state.rw_mode = CPU_RW_MODE_READ;
                state.address = (state.data << 8) | ((state.temp + state.Y) & 0xFF);
                state.temp = ((uint16_t)state.temp + (uint16_t)state.Y) >> 8;
                return state;
            case IC_IL_SAX_IND_X:
                state.rw_mode = CPU_RW_MODE_WRITE;
                state.address = (state.data << 8) | state.temp;
                state.data = state.A & state.X;
                return state;
            case IC_JMP_IND:
                state.rw_mode = CPU_RW_MODE_READ;
                state.address = (state.address & 0xFF00) | ((state.address + 1) & 0x00FF);
                state.temp = state.data;
                return state;
            case IC_JSR:
                state.rw_mode = CPU_RW_MODE_WRITE;
                state.data = state.PC & 0xFF;
                state.address = ((uint8_t)state.S--) + 0x0100;
                return state;
            case IC_RTS:
            case IC_RTI:
                state.rw_mode = CPU_RW_MODE_READ;
                state.address = ((uint8_t)++state.S) + 0x0100;
                state.temp = state.data;
                return state;

           default: break;
        }
    }
    else if (cycle == 4)
    {
        state.rw_mode = CPU_RW_MODE_NONE;
        switch (instruction)
        {
            case IC_BRK:
                state.rw_mode = CPU_RW_MODE_READ;
                state.address = 0xFF00 | state.temp;
                _CPU_SET_REG_P(state, state.P | CPU_STATUS_FLAG_IRQDISABLE);
                return state;

             case IC_LDA_ABS_X: case IC_LDA_ABS_Y:
                _CPU_SET_REG_A(state, state.data);
                break;

            case IC_LDX_ABS_Y:
                _CPU_SET_REG_X(state, state.data);
                break;

            case IC_LDY_ABS_X:
                _CPU_SET_REG_Y(state, state.data);
                break;

            case IC_IL_LAX_ABS_Y:
                _CPU_LAX(state);
                break;

            case IC_ADC_ABS_X: case IC_ADC_ABS_Y:
                _CPU_ADC(state); 
                break;

            case IC_SBC_ABS_X: case IC_SBC_ABS_Y:
                _CPU_SBC(state); 
                break;

            case IC_CMP_ABS_X: case IC_CMP_ABS_Y:
                _CPU_CMP(state, state.A);
                break;

            case IC_AND_ABS_X: case IC_AND_ABS_Y:
                _CPU_SET_REG_A(state, state.A & state.data); 
                break;

            case IC_ORA_ABS_X: case IC_ORA_ABS_Y:
                _CPU_SET_REG_A(state, state.A | state.data); 
                break;

            case IC_EOR_ABS_X: case IC_EOR_ABS_Y:
                _CPU_SET_REG_A(state, state.A ^ state.data); 
                break;

            case IC_IL_LAS_ABS_Y:
                _CPU_LAS(state);
                break;

            case IC_ROL_ABS_X:
            case IC_ROR_ABS_X:
            case IC_DEC_ABS_X:
            case IC_INC_ABS_X:
            case IC_ASL_ABS_X:
            case IC_LSR_ABS_X:
            case IC_IL_DCP_ABS_X: case IC_IL_DCP_ABS_Y:
            case IC_IL_ISB_ABS_X: case IC_IL_ISB_ABS_Y:
            case IC_IL_SLO_ABS_X: case IC_IL_SLO_ABS_Y:
            case IC_IL_RLA_ABS_X: case IC_IL_RLA_ABS_Y:
            case IC_IL_SRE_ABS_X: case IC_IL_SRE_ABS_Y:
            case IC_IL_RRA_ABS_X: case IC_IL_RRA_ABS_Y:
                state.rw_mode = CPU_RW_MODE_WRITE;
                return state;

            case IC_LDA_IND_X: _CPU_SET_REG_A(state, state.data); return state;
            case IC_ADC_IND_X: _CPU_ADC(state); return state;
            case IC_SBC_IND_X: _CPU_SBC(state); return state;
            case IC_CMP_IND_X: _CPU_CMP(state, state.A); return state;
            case IC_AND_IND_X: _CPU_SET_REG_A(state, state.A & state.data); return state;
            case IC_ORA_IND_X: _CPU_SET_REG_A(state, state.A | state.data); return state;
            case IC_EOR_IND_X: _CPU_SET_REG_A(state, state.A ^ state.data); return state;
            case IC_IL_LAX_IND_X: _CPU_LAX(state); return state;

            case IC_LDA_IND_Y: _CPU_CHECK_PAGE_CROSS(state); _CPU_SET_REG_A(state, state.data); break;
            case IC_ADC_IND_Y: _CPU_CHECK_PAGE_CROSS(state); _CPU_ADC(state); break;
            case IC_SBC_IND_Y: _CPU_CHECK_PAGE_CROSS(state); _CPU_SBC(state); break;
            case IC_CMP_IND_Y: _CPU_CHECK_PAGE_CROSS(state); _CPU_CMP(state, state.A); break;
            case IC_AND_IND_Y: _CPU_CHECK_PAGE_CROSS(state); _CPU_SET_REG_A(state, state.A & state.data); break;
            case IC_ORA_IND_Y: _CPU_CHECK_PAGE_CROSS(state); _CPU_SET_REG_A(state, state.A | state.data); break;
            case IC_EOR_IND_Y: _CPU_CHECK_PAGE_CROSS(state); _CPU_SET_REG_A(state, state.A ^ state.data); break;
            case IC_IL_LAX_IND_Y: _CPU_CHECK_PAGE_CROSS(state); _CPU_LAX(state); break;

            case IC_STA_IND_Y:
                state.rw_mode = CPU_RW_MODE_WRITE;
                state.address += state.temp * 0x0100;
                state.data = state.A;
                return state;

            case IC_JMP_IND:
                state.PC = (state.data << 8) | state.temp;
                break;
            case IC_JSR:
                state.rw_mode = CPU_RW_MODE_READ;
                state.address = state.PC;
                return state;

            case IC_IL_DCP_IND_X:
            case IC_IL_ISB_IND_X:
            case IC_IL_SLO_IND_X: 
            case IC_IL_RLA_IND_X: 
            case IC_IL_SRE_IND_X: 
            case IC_IL_RRA_IND_X: 
                /* empty cycle */
                return state;

            case IC_IL_DCP_IND_Y:
            case IC_IL_ISB_IND_Y:
            case IC_IL_SLO_IND_Y:
            case IC_IL_RLA_IND_Y:
            case IC_IL_SRE_IND_Y:
            case IC_IL_RRA_IND_Y:
                state.rw_mode = CPU_RW_MODE_READ;
                state.address += state.temp * 0x0100;
                return state;

            case IC_IL_SHA_IND_Y:
                _CPU_SHAXY(state, (state.A & state.X), was_halted);
                return state;

            case IC_ROL_ABS:
                state.rw_mode = CPU_RW_MODE_WRITE;
                _CPU_ROL(state, state.data);
                return state;

            case IC_ROR_ABS:
                state.rw_mode = CPU_RW_MODE_WRITE;
                _CPU_ROR(state, state.data);
                return state;

            case IC_DEC_ABS:
                state.rw_mode = CPU_RW_MODE_WRITE;
                _CPU_DEC(state);
                return state;

            case IC_INC_ABS:
                state.rw_mode = CPU_RW_MODE_WRITE;
                _CPU_INC(state);
                return state;

            case IC_ASL_ABS:
                state.rw_mode = CPU_RW_MODE_WRITE;
                _CPU_ASL(state, state.data);
                return state;

            case IC_LSR_ABS: 
                state.rw_mode = CPU_RW_MODE_WRITE;
                _CPU_LSR(state, state.data);
                return state;

            case IC_IL_DCP_ABS: 
                _CPU_DCP(state);
                return state;

            case IC_IL_ISB_ABS: 
                _CPU_ISB(state);
                return state;

            case IC_IL_SLO_ABS: 
                _CPU_SLO(state);
                return state;

            case IC_IL_RLA_ABS: 
                _CPU_RLA(state);
                return state;

            case IC_IL_SRE_ABS: 
                _CPU_SRE(state);
                return state;

            case IC_IL_RRA_ABS: 
                _CPU_RRA(state);
                return state;

            case IC_ROL_ZP_X:
            case IC_ROR_ZP_X:
            case IC_DEC_ZP_X:
            case IC_INC_ZP_X:
            case IC_ASL_ZP_X:
            case IC_LSR_ZP_X:
            case IC_STA_IND_X:
            case IC_IL_SAX_IND_X:
            case IC_IL_DCP_ZP_X:
            case IC_IL_ISB_ZP_X:
            case IC_IL_SLO_ZP_X:
            case IC_IL_RLA_ZP_X:
            case IC_IL_SRE_ZP_X:
            case IC_IL_RRA_ZP_X:
                state.rw_mode = CPU_RW_MODE_NONE;
                // empty cycles
                return state;
            case IC_RTS:
                state.rw_mode = CPU_RW_MODE_NONE;
                state.PC = ((state.data << 8) | state.temp) + 1;
                return state;
            case IC_RTI:
                state.rw_mode = CPU_RW_MODE_NONE;
                state.PC = (state.data << 8) | state.temp;
                return state;

            default: break;
        }
    }
    else if (cycle == 5)
    {
        state.rw_mode = CPU_RW_MODE_NONE;
        switch (instruction)
        {
            case IC_BRK:
                state.rw_mode = CPU_RW_MODE_READ;
                state.PC = state.data;
                state.address += 1;
                return state;
            case IC_JSR:
                state.PC = (state.data << 8) | state.temp;
                break;

            case IC_IL_DCP_IND_X:
            case IC_IL_DCP_IND_Y:
            case IC_IL_ISB_IND_X:
            case IC_IL_ISB_IND_Y:
            case IC_IL_SLO_IND_X:
            case IC_IL_SLO_IND_Y:
            case IC_IL_RLA_IND_X:
            case IC_IL_RLA_IND_Y:
            case IC_IL_SRE_IND_X:
            case IC_IL_SRE_IND_Y:
            case IC_IL_RRA_IND_X:
            case IC_IL_RRA_IND_Y:
                state.rw_mode = CPU_RW_MODE_WRITE;
                return state;

            case IC_ROL_ABS_X:
                state.rw_mode = CPU_RW_MODE_WRITE;
                _CPU_ROL(state, state.data);
                return state;

            case IC_ROR_ABS_X:
                state.rw_mode = CPU_RW_MODE_WRITE;
                _CPU_ROR(state, state.data);
                return state;

            case IC_DEC_ABS_X:
                state.rw_mode = CPU_RW_MODE_WRITE;
                _CPU_DEC(state);
                return state;

            case IC_INC_ABS_X:
                state.rw_mode = CPU_RW_MODE_WRITE;
                _CPU_INC(state);
                return state;

            case IC_ASL_ABS_X:
                state.rw_mode = CPU_RW_MODE_WRITE;
                _CPU_ASL(state, state.data);
                return state;

            case IC_LSR_ABS_X:
                state.rw_mode = CPU_RW_MODE_WRITE;
                _CPU_LSR(state, state.data);
                return state;

            case IC_IL_DCP_ABS_X: case IC_IL_DCP_ABS_Y:
                _CPU_DCP(state);
                return state;

            case IC_IL_ISB_ABS_X: case IC_IL_ISB_ABS_Y:
                _CPU_ISB(state);
                return state;

            case IC_IL_SLO_ABS_X: case IC_IL_SLO_ABS_Y:
                _CPU_SLO(state);
                return state;

            case IC_IL_RLA_ABS_X: case IC_IL_RLA_ABS_Y:
                _CPU_RLA(state);
                return state;

            case IC_IL_SRE_ABS_X: case IC_IL_SRE_ABS_Y:
                _CPU_SRE(state);
                return state;

            case IC_IL_RRA_ABS_X: case IC_IL_RRA_ABS_Y:
                _CPU_RRA(state);
                return state;

            /* Executed if page-cross */
            case IC_LDA_IND_Y: _CPU_SET_REG_A(state, state.data); break;
            case IC_ADC_IND_Y: _CPU_ADC(state); break;
            case IC_SBC_IND_Y: _CPU_SBC(state); break;
            case IC_CMP_IND_Y: _CPU_CMP(state, state.A); break;
            case IC_AND_IND_Y: _CPU_SET_REG_A(state, state.A & state.data); break;
            case IC_ORA_IND_Y: _CPU_SET_REG_A(state, state.A | state.data); break;
            case IC_EOR_IND_Y: _CPU_SET_REG_A(state, state.A ^ state.data); break;
            case IC_IL_LAX_IND_Y: _CPU_LAX(state); break;
        }
    }
    else if (cycle == 6)
    {
        switch(instruction)
        {
            case IC_BRK:
                state.PC = (state.data << 8) | state.PC;
                nmi_phase1 = 0;
                break;
            case IC_IL_DCP_IND_X:
            case IC_IL_DCP_IND_Y: 
                _CPU_DCP(state); 
                return state;

            case IC_IL_ISB_IND_X:
            case IC_IL_ISB_IND_Y: 
                _CPU_ISB(state); 
                return state;

            case IC_IL_SLO_IND_X:
            case IC_IL_SLO_IND_Y: 
                _CPU_SLO(state); 
                return state;

            case IC_IL_RLA_IND_X:
            case IC_IL_RLA_IND_Y: 
                _CPU_RLA(state); 
                return state;

            case IC_IL_SRE_IND_X:
            case IC_IL_SRE_IND_Y: 
                _CPU_SRE(state); 
                return state;

            case IC_IL_RRA_IND_X:
            case IC_IL_RRA_IND_Y: 
                _CPU_RRA(state); 
                return state;
        }
    }

    if (nmi_phase1 || irq_phase1)
    {
        state.rw_mode = CPU_RW_MODE_NONE;
        state.data = 0;
        state.cycle = 0;
        state.temp = 0xFE;
    }
    else
    {
        state.rw_mode = CPU_RW_MODE_READ;
        state.address = state.PC++;
        state.cycle = 0;
        state.temp = 0;
    }

    return state;
}